

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [12];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [28];
  int iVar82;
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  long lVar89;
  undefined4 uVar90;
  undefined8 unaff_R14;
  ulong uVar91;
  undefined8 uVar92;
  float fVar112;
  vint4 bi_2;
  undefined1 auVar93 [16];
  float fVar110;
  float fVar113;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar111;
  float fVar114;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar97 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar152 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  vint4 ai;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  vint4 bi;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  vint4 ai_1;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar187;
  float fVar191;
  float fVar193;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar192;
  float fVar194;
  float fVar196;
  undefined1 auVar190 [32];
  float fVar200;
  float fVar207;
  float fVar208;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar209;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar206 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined4 uVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined4 local_960;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 (*local_788) [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [2] [32];
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar85 = (ulong)(byte)PVar6;
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar138 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  auVar93._0_4_ = fVar138 * auVar12._0_4_;
  auVar93._4_4_ = fVar138 * auVar12._4_4_;
  auVar93._8_4_ = fVar138 * auVar12._8_4_;
  auVar93._12_4_ = fVar138 * auVar12._12_4_;
  auVar164._0_4_ = fVar138 * auVar13._0_4_;
  auVar164._4_4_ = fVar138 * auVar13._4_4_;
  auVar164._8_4_ = fVar138 * auVar13._8_4_;
  auVar164._12_4_ = fVar138 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x12 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x13 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x14 + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar230._4_4_ = auVar164._0_4_;
  auVar230._0_4_ = auVar164._0_4_;
  auVar230._8_4_ = auVar164._0_4_;
  auVar230._12_4_ = auVar164._0_4_;
  auVar119 = vshufps_avx(auVar164,auVar164,0x55);
  auVar94 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar138 = auVar94._0_4_;
  auVar216._0_4_ = fVar138 * auVar14._0_4_;
  fVar110 = auVar94._4_4_;
  auVar216._4_4_ = fVar110 * auVar14._4_4_;
  fVar111 = auVar94._8_4_;
  auVar216._8_4_ = fVar111 * auVar14._8_4_;
  fVar113 = auVar94._12_4_;
  auVar216._12_4_ = fVar113 * auVar14._12_4_;
  auVar201._0_4_ = auVar17._0_4_ * fVar138;
  auVar201._4_4_ = auVar17._4_4_ * fVar110;
  auVar201._8_4_ = auVar17._8_4_ * fVar111;
  auVar201._12_4_ = auVar17._12_4_ * fVar113;
  auVar183._0_4_ = auVar139._0_4_ * fVar138;
  auVar183._4_4_ = auVar139._4_4_ * fVar110;
  auVar183._8_4_ = auVar139._8_4_ * fVar111;
  auVar183._12_4_ = auVar139._12_4_ * fVar113;
  auVar94 = vfmadd231ps_fma(auVar216,auVar119,auVar13);
  auVar120 = vfmadd231ps_fma(auVar201,auVar119,auVar16);
  auVar119 = vfmadd231ps_fma(auVar183,auVar95,auVar119);
  auVar151 = vfmadd231ps_fma(auVar94,auVar230,auVar12);
  auVar120 = vfmadd231ps_fma(auVar120,auVar230,auVar15);
  auVar159 = vfmadd231ps_fma(auVar119,auVar96,auVar230);
  auVar231._4_4_ = auVar93._0_4_;
  auVar231._0_4_ = auVar93._0_4_;
  auVar231._8_4_ = auVar93._0_4_;
  auVar231._12_4_ = auVar93._0_4_;
  auVar119 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar138 = auVar94._0_4_;
  auVar165._0_4_ = fVar138 * auVar14._0_4_;
  fVar110 = auVar94._4_4_;
  auVar165._4_4_ = fVar110 * auVar14._4_4_;
  fVar111 = auVar94._8_4_;
  auVar165._8_4_ = fVar111 * auVar14._8_4_;
  fVar113 = auVar94._12_4_;
  auVar165._12_4_ = fVar113 * auVar14._12_4_;
  auVar118._0_4_ = auVar17._0_4_ * fVar138;
  auVar118._4_4_ = auVar17._4_4_ * fVar110;
  auVar118._8_4_ = auVar17._8_4_ * fVar111;
  auVar118._12_4_ = auVar17._12_4_ * fVar113;
  auVar94._0_4_ = auVar139._0_4_ * fVar138;
  auVar94._4_4_ = auVar139._4_4_ * fVar110;
  auVar94._8_4_ = auVar139._8_4_ * fVar111;
  auVar94._12_4_ = auVar139._12_4_ * fVar113;
  auVar13 = vfmadd231ps_fma(auVar165,auVar119,auVar13);
  auVar14 = vfmadd231ps_fma(auVar118,auVar119,auVar16);
  auVar16 = vfmadd231ps_fma(auVar94,auVar119,auVar95);
  auVar17 = vfmadd231ps_fma(auVar13,auVar231,auVar12);
  auVar95 = vfmadd231ps_fma(auVar14,auVar231,auVar15);
  auVar139 = vfmadd231ps_fma(auVar16,auVar231,auVar96);
  local_3d0._8_4_ = 0x7fffffff;
  local_3d0._0_8_ = 0x7fffffff7fffffff;
  local_3d0._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar151,local_3d0);
  auVar158._8_4_ = 0x219392ef;
  auVar158._0_8_ = 0x219392ef219392ef;
  auVar158._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar158,1);
  auVar13 = vblendvps_avx(auVar151,auVar158,auVar12);
  auVar12 = vandps_avx(auVar120,local_3d0);
  auVar12 = vcmpps_avx(auVar12,auVar158,1);
  auVar14 = vblendvps_avx(auVar120,auVar158,auVar12);
  auVar12 = vandps_avx(local_3d0,auVar159);
  auVar12 = vcmpps_avx(auVar12,auVar158,1);
  auVar12 = vblendvps_avx(auVar159,auVar158,auVar12);
  auVar15 = vrcpps_avx(auVar13);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar184);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar184);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar184);
  auVar96 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar159._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar159._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar159._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar159._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar166._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar166._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar166._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar166._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar85 * 0xe + 6);
  auVar12 = vpmovsxwd_avx(auVar14);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar95);
  auVar176._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar176._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar176._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar176._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar120._1_3_ = 0;
  auVar120[0] = PVar6;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar15);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar95);
  auVar119._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar119._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar119._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar119._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar85 * 0x15 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar139);
  auVar151._0_4_ = auVar96._0_4_ * auVar12._0_4_;
  auVar151._4_4_ = auVar96._4_4_ * auVar12._4_4_;
  auVar151._8_4_ = auVar96._8_4_ * auVar12._8_4_;
  auVar151._12_4_ = auVar96._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar85 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar139);
  auVar95._0_4_ = auVar96._0_4_ * auVar12._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar12._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar12._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar159,auVar166);
  auVar13 = vpminsd_avx(auVar176,auVar119);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar151,auVar95);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar202._4_4_ = uVar90;
  auVar202._0_4_ = uVar90;
  auVar202._8_4_ = uVar90;
  auVar202._12_4_ = uVar90;
  auVar13 = vmaxps_avx(auVar13,auVar202);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_3e0._0_4_ = auVar12._0_4_ * 0.99999964;
  local_3e0._4_4_ = auVar12._4_4_ * 0.99999964;
  local_3e0._8_4_ = auVar12._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar159,auVar166);
  auVar13 = vpmaxsd_avx(auVar176,auVar119);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar151,auVar95);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar139._4_4_ = uVar90;
  auVar139._0_4_ = uVar90;
  auVar139._8_4_ = uVar90;
  auVar139._12_4_ = uVar90;
  auVar13 = vminps_avx(auVar13,auVar139);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar96._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar120[4] = PVar6;
  auVar120._5_3_ = 0;
  auVar120[8] = PVar6;
  auVar120._9_3_ = 0;
  auVar120[0xc] = PVar6;
  auVar120._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar120,_DAT_01f4ad30);
  auVar12 = vcmpps_avx(local_3e0,auVar96,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar90 = vmovmskps_avx(auVar12);
  uVar91 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar90);
  local_6a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_6a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_6a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_6a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_788 = (undefined1 (*) [32])&local_140;
  iVar82 = 1 << ((uint)k & 0x1f);
  auVar98._4_4_ = iVar82;
  auVar98._0_4_ = iVar82;
  auVar98._8_4_ = iVar82;
  auVar98._12_4_ = iVar82;
  auVar98._16_4_ = iVar82;
  auVar98._20_4_ = iVar82;
  auVar98._24_4_ = iVar82;
  auVar98._28_4_ = iVar82;
  auVar121 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar98 = vpand_avx2(auVar98,auVar121);
  local_280 = vpcmpeqd_avx2(auVar98,auVar121);
  do {
    if (uVar91 == 0) {
      return;
    }
    lVar88 = 0;
    for (uVar86 = uVar91; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
      lVar88 = lVar88 + 1;
    }
    uVar91 = uVar91 - 1 & uVar91;
    uVar83 = *(uint *)(prim + lVar88 * 4 + 6);
    uVar86 = (ulong)(uint)((int)lVar88 << 6);
    uVar7 = *(uint *)(prim + 2);
    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
    pPVar1 = prim + uVar86 + uVar85 * 0x19 + 0x16;
    uVar78 = *(undefined8 *)pPVar1;
    uVar79 = *(undefined8 *)(pPVar1 + 8);
    auVar14 = *(undefined1 (*) [16])pPVar1;
    auVar13 = *(undefined1 (*) [16])pPVar1;
    auVar12 = *(undefined1 (*) [16])pPVar1;
    if (uVar91 != 0) {
      uVar87 = uVar91 - 1 & uVar91;
      for (uVar21 = uVar91; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
      }
      if (uVar87 != 0) {
        for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar15 = *(undefined1 (*) [16])(prim + uVar86 + uVar85 * 0x19 + 0x26);
    auVar16 = *(undefined1 (*) [16])(prim + uVar86 + uVar85 * 0x19 + 0x36);
    auVar17 = *(undefined1 (*) [16])(prim + uVar86 + uVar85 * 0x19 + 0x46);
    iVar82 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar119 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar95 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar119);
    uVar90 = auVar95._0_4_;
    auVar160._4_4_ = uVar90;
    auVar160._0_4_ = uVar90;
    auVar160._8_4_ = uVar90;
    auVar160._12_4_ = uVar90;
    auVar96 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar138 = pre->ray_space[k].vz.field_0.m128[0];
    fVar110 = pre->ray_space[k].vz.field_0.m128[1];
    fVar111 = pre->ray_space[k].vz.field_0.m128[2];
    fVar113 = pre->ray_space[k].vz.field_0.m128[3];
    auVar177._0_4_ = fVar138 * auVar95._0_4_;
    auVar177._4_4_ = fVar110 * auVar95._4_4_;
    auVar177._8_4_ = fVar111 * auVar95._8_4_;
    auVar177._12_4_ = fVar113 * auVar95._12_4_;
    auVar96 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar5,auVar96);
    auVar120 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar160);
    auVar96 = vblendps_avx(auVar120,*(undefined1 (*) [16])pPVar1,8);
    auVar139 = vsubps_avx(auVar15,auVar119);
    uVar90 = auVar139._0_4_;
    auVar178._4_4_ = uVar90;
    auVar178._0_4_ = uVar90;
    auVar178._8_4_ = uVar90;
    auVar178._12_4_ = uVar90;
    auVar95 = vshufps_avx(auVar139,auVar139,0x55);
    auVar139 = vshufps_avx(auVar139,auVar139,0xaa);
    auVar217._0_4_ = fVar138 * auVar139._0_4_;
    auVar217._4_4_ = fVar110 * auVar139._4_4_;
    auVar217._8_4_ = fVar111 * auVar139._8_4_;
    auVar217._12_4_ = fVar113 * auVar139._12_4_;
    auVar95 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar95);
    auVar151 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar178);
    auVar95 = vblendps_avx(auVar151,auVar15,8);
    auVar94 = vsubps_avx(auVar16,auVar119);
    uVar90 = auVar94._0_4_;
    auVar185._4_4_ = uVar90;
    auVar185._0_4_ = uVar90;
    auVar185._8_4_ = uVar90;
    auVar185._12_4_ = uVar90;
    auVar139 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar223._0_4_ = fVar138 * auVar94._0_4_;
    auVar223._4_4_ = fVar110 * auVar94._4_4_;
    auVar223._8_4_ = fVar111 * auVar94._8_4_;
    auVar223._12_4_ = fVar113 * auVar94._12_4_;
    auVar139 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar139);
    auVar159 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar4,auVar185);
    auVar139 = vblendps_avx(auVar159,auVar16,8);
    auVar94 = vsubps_avx(auVar17,auVar119);
    uVar90 = auVar94._0_4_;
    auVar186._4_4_ = uVar90;
    auVar186._0_4_ = uVar90;
    auVar186._8_4_ = uVar90;
    auVar186._12_4_ = uVar90;
    auVar119 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar224._0_4_ = fVar138 * auVar94._0_4_;
    auVar224._4_4_ = fVar110 * auVar94._4_4_;
    auVar224._8_4_ = fVar111 * auVar94._8_4_;
    auVar224._12_4_ = fVar113 * auVar94._12_4_;
    auVar119 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar119);
    auVar93 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar4,auVar186);
    auVar119 = vblendps_avx(auVar93,auVar17,8);
    auVar96 = vandps_avx(auVar96,local_3d0);
    auVar95 = vandps_avx(auVar95,local_3d0);
    auVar94 = vmaxps_avx(auVar96,auVar95);
    auVar96 = vandps_avx(auVar139,local_3d0);
    auVar95 = vandps_avx(auVar119,local_3d0);
    auVar96 = vmaxps_avx(auVar96,auVar95);
    auVar96 = vmaxps_avx(auVar94,auVar96);
    auVar95 = vmovshdup_avx(auVar96);
    auVar95 = vmaxss_avx(auVar95,auVar96);
    auVar96 = vshufpd_avx(auVar96,auVar96,1);
    auVar96 = vmaxss_avx(auVar96,auVar95);
    lVar88 = (long)iVar82 * 0x44;
    auVar95 = vmovshdup_avx(auVar120);
    uVar92 = auVar95._0_8_;
    local_600._8_8_ = uVar92;
    local_600._0_8_ = uVar92;
    local_600._16_8_ = uVar92;
    local_600._24_8_ = uVar92;
    auVar95 = vmovshdup_avx(auVar151);
    uVar92 = auVar95._0_8_;
    local_580._8_8_ = uVar92;
    local_580._0_8_ = uVar92;
    local_580._16_8_ = uVar92;
    local_580._24_8_ = uVar92;
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x908);
    uVar222 = auVar159._0_4_;
    local_6e0._4_4_ = uVar222;
    local_6e0._0_4_ = uVar222;
    local_6e0._8_4_ = uVar222;
    local_6e0._12_4_ = uVar222;
    local_6e0._16_4_ = uVar222;
    local_6e0._20_4_ = uVar222;
    local_6e0._24_4_ = uVar222;
    local_6e0._28_4_ = uVar222;
    auVar95 = vmovshdup_avx(auVar159);
    uVar92 = auVar95._0_8_;
    local_620._8_8_ = uVar92;
    local_620._0_8_ = uVar92;
    local_620._16_8_ = uVar92;
    local_620._24_8_ = uVar92;
    pauVar2 = (undefined1 (*) [32])(bezier_basis0 + lVar88 + 0xd8c);
    fVar75 = *(float *)*pauVar2;
    fVar76 = *(float *)(bezier_basis0 + lVar88 + 0xd90);
    fVar77 = *(float *)(bezier_basis0 + lVar88 + 0xd94);
    fVar112 = *(float *)(bezier_basis0 + lVar88 + 0xd98);
    fVar114 = *(float *)(bezier_basis0 + lVar88 + 0xd9c);
    fVar115 = *(float *)(bezier_basis0 + lVar88 + 0xda0);
    fVar116 = *(float *)(bezier_basis0 + lVar88 + 0xda4);
    auVar81 = *(undefined1 (*) [28])*pauVar2;
    local_500 = auVar93._0_4_;
    auVar95 = vmovshdup_avx(auVar93);
    local_720 = auVar95._0_8_;
    auVar121._0_4_ = local_500 * fVar75;
    auVar121._4_4_ = local_500 * fVar76;
    auVar121._8_4_ = local_500 * fVar77;
    auVar121._12_4_ = local_500 * fVar112;
    auVar121._16_4_ = local_500 * fVar114;
    auVar121._20_4_ = local_500 * fVar115;
    auVar121._24_4_ = local_500 * fVar116;
    auVar121._28_4_ = 0;
    auVar139 = vfmadd231ps_fma(auVar121,auVar98,local_6e0);
    fVar138 = auVar95._0_4_;
    auVar175._0_4_ = fVar75 * fVar138;
    fVar111 = auVar95._4_4_;
    auVar175._4_4_ = fVar76 * fVar111;
    auVar175._8_4_ = fVar77 * fVar138;
    auVar175._12_4_ = fVar112 * fVar111;
    auVar175._16_4_ = fVar114 * fVar138;
    auVar175._20_4_ = fVar115 * fVar111;
    auVar175._24_4_ = fVar116 * fVar138;
    auVar175._28_4_ = 0;
    auVar95 = vfmadd231ps_fma(auVar175,auVar98,local_620);
    auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x484);
    uVar90 = auVar151._0_4_;
    auVar188._4_4_ = uVar90;
    auVar188._0_4_ = uVar90;
    auVar188._8_4_ = uVar90;
    auVar188._12_4_ = uVar90;
    auVar188._16_4_ = uVar90;
    auVar188._20_4_ = uVar90;
    auVar188._24_4_ = uVar90;
    auVar188._28_4_ = uVar90;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar121,auVar188);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar121,local_580);
    auVar175 = *(undefined1 (*) [32])(bezier_basis0 + lVar88);
    local_960 = auVar120._0_4_;
    auVar154._4_4_ = local_960;
    auVar154._0_4_ = local_960;
    auVar154._8_4_ = local_960;
    auVar154._12_4_ = local_960;
    auVar154._16_4_ = local_960;
    auVar154._20_4_ = local_960;
    auVar154._24_4_ = local_960;
    auVar154._28_4_ = local_960;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar175,auVar154);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar175,local_600);
    auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x908);
    fVar117 = *(float *)(bezier_basis1 + lVar88 + 0xd8c);
    fVar192 = *(float *)(bezier_basis1 + lVar88 + 0xd90);
    fVar194 = *(float *)(bezier_basis1 + lVar88 + 0xd94);
    fVar196 = *(float *)(bezier_basis1 + lVar88 + 0xd98);
    fVar211 = *(float *)(bezier_basis1 + lVar88 + 0xd9c);
    fVar213 = *(float *)(bezier_basis1 + lVar88 + 0xda0);
    fVar215 = *(float *)(bezier_basis1 + lVar88 + 0xda4);
    auVar99._0_4_ = local_500 * fVar117;
    auVar99._4_4_ = local_500 * fVar192;
    auVar99._8_4_ = local_500 * fVar194;
    auVar99._12_4_ = local_500 * fVar196;
    auVar99._16_4_ = local_500 * fVar211;
    auVar99._20_4_ = local_500 * fVar213;
    auVar99._24_4_ = local_500 * fVar215;
    auVar99._28_4_ = 0;
    auVar119 = vfmadd231ps_fma(auVar99,auVar106,local_6e0);
    auVar107._4_4_ = fVar192 * fVar111;
    auVar107._0_4_ = fVar117 * fVar138;
    auVar107._8_4_ = fVar194 * fVar138;
    auVar107._12_4_ = fVar196 * fVar111;
    auVar107._16_4_ = fVar211 * fVar138;
    auVar107._20_4_ = fVar213 * fVar111;
    auVar107._24_4_ = fVar215 * fVar138;
    auVar107._28_4_ = uVar222;
    auVar94 = vfmadd231ps_fma(auVar107,auVar106,local_620);
    auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x484);
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar107,auVar188);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar107,local_580);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar88);
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar99,auVar154);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar99,local_600);
    local_400 = ZEXT1632(auVar119);
    auVar122 = ZEXT1632(auVar139);
    local_520 = vsubps_avx(local_400,auVar122);
    local_420 = ZEXT1632(auVar94);
    local_440 = ZEXT1632(auVar95);
    local_460 = vsubps_avx(local_420,local_440);
    auVar100._0_4_ = auVar95._0_4_ * local_520._0_4_;
    auVar100._4_4_ = auVar95._4_4_ * local_520._4_4_;
    auVar100._8_4_ = auVar95._8_4_ * local_520._8_4_;
    auVar100._12_4_ = auVar95._12_4_ * local_520._12_4_;
    auVar100._16_4_ = local_520._16_4_ * 0.0;
    auVar100._20_4_ = local_520._20_4_ * 0.0;
    auVar100._24_4_ = local_520._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    fVar187 = local_460._0_4_;
    auVar123._0_4_ = fVar187 * auVar139._0_4_;
    fVar191 = local_460._4_4_;
    auVar123._4_4_ = fVar191 * auVar139._4_4_;
    fVar193 = local_460._8_4_;
    auVar123._8_4_ = fVar193 * auVar139._8_4_;
    fVar195 = local_460._12_4_;
    auVar123._12_4_ = fVar195 * auVar139._12_4_;
    fVar197 = local_460._16_4_;
    auVar123._16_4_ = fVar197 * 0.0;
    fVar198 = local_460._20_4_;
    auVar123._20_4_ = fVar198 * 0.0;
    fVar199 = local_460._24_4_;
    auVar123._24_4_ = fVar199 * 0.0;
    auVar123._28_4_ = 0;
    auVar100 = vsubps_avx(auVar100,auVar123);
    auVar95 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar92 = auVar95._0_8_;
    local_80._8_8_ = uVar92;
    local_80._0_8_ = uVar92;
    local_80._16_8_ = uVar92;
    local_80._24_8_ = uVar92;
    auVar139 = vpermilps_avx(auVar15,0xff);
    uVar92 = auVar139._0_8_;
    local_a0._8_8_ = uVar92;
    local_a0._0_8_ = uVar92;
    local_a0._16_8_ = uVar92;
    local_a0._24_8_ = uVar92;
    auVar139 = vpermilps_avx(auVar16,0xff);
    uVar92 = auVar139._0_8_;
    local_c0._8_8_ = uVar92;
    local_c0._0_8_ = uVar92;
    local_c0._16_8_ = uVar92;
    local_c0._24_8_ = uVar92;
    auVar139 = vpermilps_avx(auVar17,0xff);
    local_e0 = auVar139._0_8_;
    fVar110 = auVar139._0_4_;
    fVar113 = auVar139._4_4_;
    auVar171._4_4_ = fVar76 * fVar113;
    auVar171._0_4_ = fVar75 * fVar110;
    auVar171._8_4_ = fVar77 * fVar110;
    auVar171._12_4_ = fVar112 * fVar113;
    auVar171._16_4_ = fVar114 * fVar110;
    auVar171._20_4_ = fVar115 * fVar113;
    auVar171._24_4_ = fVar116 * fVar110;
    auVar171._28_4_ = local_960;
    auVar139 = vfmadd231ps_fma(auVar171,local_c0,auVar98);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar121,local_a0);
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar175,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar19._4_4_ = fVar192 * fVar113;
    auVar19._0_4_ = fVar117 * fVar110;
    auVar19._8_4_ = fVar194 * fVar110;
    auVar19._12_4_ = fVar196 * fVar113;
    auVar19._16_4_ = fVar211 * fVar110;
    auVar19._20_4_ = fVar213 * fVar113;
    auVar19._24_4_ = fVar215 * fVar110;
    auVar19._28_4_ = auVar175._28_4_;
    auVar139 = vfmadd231ps_fma(auVar19,auVar106,local_c0);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar107,local_a0);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar99,local_80);
    auVar129._4_4_ = fVar191 * fVar191;
    auVar129._0_4_ = fVar187 * fVar187;
    auVar129._8_4_ = fVar193 * fVar193;
    auVar129._12_4_ = fVar195 * fVar195;
    auVar129._16_4_ = fVar197 * fVar197;
    auVar129._20_4_ = fVar198 * fVar198;
    auVar129._24_4_ = fVar199 * fVar199;
    auVar129._28_4_ = auVar95._4_4_;
    auVar95 = vfmadd231ps_fma(auVar129,local_520,local_520);
    auVar171 = vmaxps_avx(ZEXT1632(auVar119),ZEXT1632(auVar94));
    auVar181._4_4_ = auVar171._4_4_ * auVar171._4_4_ * auVar95._4_4_;
    auVar181._0_4_ = auVar171._0_4_ * auVar171._0_4_ * auVar95._0_4_;
    auVar181._8_4_ = auVar171._8_4_ * auVar171._8_4_ * auVar95._8_4_;
    auVar181._12_4_ = auVar171._12_4_ * auVar171._12_4_ * auVar95._12_4_;
    auVar181._16_4_ = auVar171._16_4_ * auVar171._16_4_ * 0.0;
    auVar181._20_4_ = auVar171._20_4_ * auVar171._20_4_ * 0.0;
    auVar181._24_4_ = auVar171._24_4_ * auVar171._24_4_ * 0.0;
    auVar181._28_4_ = auVar171._28_4_;
    auVar220._4_4_ = auVar100._4_4_ * auVar100._4_4_;
    auVar220._0_4_ = auVar100._0_4_ * auVar100._0_4_;
    auVar220._8_4_ = auVar100._8_4_ * auVar100._8_4_;
    auVar220._12_4_ = auVar100._12_4_ * auVar100._12_4_;
    auVar220._16_4_ = auVar100._16_4_ * auVar100._16_4_;
    auVar220._20_4_ = auVar100._20_4_ * auVar100._20_4_;
    auVar220._24_4_ = auVar100._24_4_ * auVar100._24_4_;
    auVar220._28_4_ = auVar100._28_4_;
    local_540._0_4_ = (undefined4)iVar82;
    register0x00001504 = auVar93._4_12_;
    auVar171 = vcmpps_avx(auVar220,auVar181,2);
    fVar110 = auVar96._0_4_ * 4.7683716e-07;
    auVar101._4_4_ = local_540._0_4_;
    auVar101._0_4_ = local_540._0_4_;
    auVar101._8_4_ = local_540._0_4_;
    auVar101._12_4_ = local_540._0_4_;
    auVar101._16_4_ = local_540._0_4_;
    auVar101._20_4_ = local_540._0_4_;
    auVar101._24_4_ = local_540._0_4_;
    auVar101._28_4_ = local_540._0_4_;
    auVar100 = vcmpps_avx(_DAT_01f7b060,auVar101,1);
    auVar95 = vpermilps_avx(auVar120,0xaa);
    uVar92 = auVar95._0_8_;
    local_760._8_8_ = uVar92;
    local_760._0_8_ = uVar92;
    local_760._16_8_ = uVar92;
    local_760._24_8_ = uVar92;
    auVar229 = ZEXT3264(local_760);
    auVar96 = vpermilps_avx(auVar151,0xaa);
    uVar92 = auVar96._0_8_;
    local_240._8_8_ = uVar92;
    local_240._0_8_ = uVar92;
    local_240._16_8_ = uVar92;
    local_240._24_8_ = uVar92;
    auVar139 = vpermilps_avx(auVar159,0xaa);
    uVar92 = auVar139._0_8_;
    auVar189._8_8_ = uVar92;
    auVar189._0_8_ = uVar92;
    auVar189._16_8_ = uVar92;
    auVar189._24_8_ = uVar92;
    auVar96 = vshufps_avx(auVar93,auVar93,0xaa);
    uVar92 = auVar96._0_8_;
    register0x00001508 = uVar92;
    local_7e0 = uVar92;
    register0x00001510 = uVar92;
    register0x00001518 = uVar92;
    auVar227 = ZEXT3264(_local_7e0);
    auVar19 = auVar100 & auVar171;
    uVar90 = *(undefined4 *)(ray + k * 4 + 0x60);
    local_640._0_16_ = ZEXT416(uVar7);
    local_560 = ZEXT416(uVar83);
    local_870 = auVar15._0_8_;
    uStack_868 = auVar15._8_8_;
    local_880 = auVar16._0_8_;
    uStack_878 = auVar16._8_8_;
    local_890._0_4_ = auVar17._0_4_;
    fVar113 = (float)local_890;
    local_890._4_4_ = auVar17._4_4_;
    fVar75 = local_890._4_4_;
    uStack_888._0_4_ = auVar17._8_4_;
    fVar76 = (float)uStack_888;
    uStack_888._4_4_ = auVar17._12_4_;
    fVar77 = uStack_888._4_4_;
    local_890 = auVar17._0_8_;
    uStack_888 = auVar17._8_8_;
    uStack_718 = local_720;
    uStack_710 = local_720;
    uStack_708 = local_720;
    fStack_4fc = local_500;
    fStack_4f8 = local_500;
    fStack_4f4 = local_500;
    fStack_4f0 = local_500;
    fStack_4ec = local_500;
    fStack_4e8 = local_500;
    fStack_4e4 = local_500;
    local_560._0_4_ = uVar83;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0x7f,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar19 >> 0xbf,0) == '\0') &&
        (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f]) {
      auVar137 = ZEXT3264(local_780);
      auVar157 = ZEXT3264(local_6e0);
    }
    else {
      local_660 = SUB84(pGVar9,0);
      uStack_65c = (undefined4)((ulong)pGVar9 >> 0x20);
      _local_4a0 = vandps_avx(auVar171,auVar100);
      fVar187 = auVar96._0_4_;
      fVar191 = auVar96._4_4_;
      auVar18._4_4_ = fVar191 * fVar192;
      auVar18._0_4_ = fVar187 * fVar117;
      auVar18._8_4_ = fVar187 * fVar194;
      auVar18._12_4_ = fVar191 * fVar196;
      auVar18._16_4_ = fVar187 * fVar211;
      auVar18._20_4_ = fVar191 * fVar213;
      auVar18._24_4_ = fVar187 * fVar215;
      auVar18._28_4_ = local_4a0._28_4_;
      auVar17 = vfmadd213ps_fma(auVar106,auVar189,auVar18);
      auVar17 = vfmadd213ps_fma(auVar107,local_240,ZEXT1632(auVar17));
      auVar17 = vfmadd213ps_fma(auVar99,local_760,ZEXT1632(auVar17));
      local_480._0_4_ = auVar81._0_4_;
      local_480._4_4_ = auVar81._4_4_;
      fStack_478 = auVar81._8_4_;
      fStack_474 = auVar81._12_4_;
      fStack_470 = auVar81._16_4_;
      fStack_46c = auVar81._20_4_;
      fStack_468 = auVar81._24_4_;
      auVar102._0_4_ = fVar187 * (float)local_480._0_4_;
      auVar102._4_4_ = fVar191 * (float)local_480._4_4_;
      auVar102._8_4_ = fVar187 * fStack_478;
      auVar102._12_4_ = fVar191 * fStack_474;
      auVar102._16_4_ = fVar187 * fStack_470;
      auVar102._20_4_ = fVar191 * fStack_46c;
      auVar102._24_4_ = fVar187 * fStack_468;
      auVar102._28_4_ = 0;
      auVar96 = vfmadd213ps_fma(auVar98,auVar189,auVar102);
      auVar96 = vfmadd213ps_fma(auVar121,local_240,ZEXT1632(auVar96));
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x1210);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x1694);
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x1b18);
      fVar112 = *(float *)(bezier_basis0 + lVar88 + 0x1f9c);
      fVar114 = *(float *)(bezier_basis0 + lVar88 + 0x1fa0);
      fVar115 = *(float *)(bezier_basis0 + lVar88 + 0x1fa4);
      fVar116 = *(float *)(bezier_basis0 + lVar88 + 0x1fa8);
      fVar117 = *(float *)(bezier_basis0 + lVar88 + 0x1fac);
      fVar192 = *(float *)(bezier_basis0 + lVar88 + 0x1fb0);
      fVar194 = *(float *)(bezier_basis0 + lVar88 + 0x1fb4);
      auVar179._4_4_ = local_500 * fVar114;
      auVar179._0_4_ = local_500 * fVar112;
      auVar179._8_4_ = local_500 * fVar115;
      auVar179._12_4_ = local_500 * fVar116;
      auVar179._16_4_ = local_500 * fVar117;
      auVar179._20_4_ = local_500 * fVar192;
      auVar179._24_4_ = local_500 * fVar194;
      auVar179._28_4_ = auVar121._28_4_;
      auVar22._4_4_ = fVar114 * fVar111;
      auVar22._0_4_ = fVar112 * fVar138;
      auVar22._8_4_ = fVar115 * fVar138;
      auVar22._12_4_ = fVar116 * fVar111;
      auVar22._16_4_ = fVar117 * fVar138;
      auVar22._20_4_ = fVar192 * fVar111;
      auVar22._24_4_ = fVar194 * fVar138;
      auVar22._28_4_ = auVar139._4_4_;
      auVar23._4_4_ = fVar191 * fVar114;
      auVar23._0_4_ = fVar187 * fVar112;
      auVar23._8_4_ = fVar187 * fVar115;
      auVar23._12_4_ = fVar191 * fVar116;
      auVar23._16_4_ = fVar187 * fVar117;
      auVar23._20_4_ = fVar191 * fVar192;
      auVar23._24_4_ = fVar187 * fVar194;
      auVar23._28_4_ = fVar191;
      auVar139 = vfmadd231ps_fma(auVar179,auVar107,local_6e0);
      auVar120 = vfmadd231ps_fma(auVar22,auVar107,local_620);
      auVar151 = vfmadd231ps_fma(auVar23,auVar189,auVar107);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar106,auVar188);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar106,local_580);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_240,auVar106);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar98,auVar154);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar98,local_600);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_760,auVar98);
      fVar112 = *(float *)(bezier_basis1 + lVar88 + 0x1f9c);
      fVar114 = *(float *)(bezier_basis1 + lVar88 + 0x1fa0);
      fVar115 = *(float *)(bezier_basis1 + lVar88 + 0x1fa4);
      fVar116 = *(float *)(bezier_basis1 + lVar88 + 0x1fa8);
      fVar117 = *(float *)(bezier_basis1 + lVar88 + 0x1fac);
      fVar192 = *(float *)(bezier_basis1 + lVar88 + 0x1fb0);
      fVar194 = *(float *)(bezier_basis1 + lVar88 + 0x1fb4);
      auVar106._4_4_ = local_500 * fVar114;
      auVar106._0_4_ = local_500 * fVar112;
      auVar106._8_4_ = local_500 * fVar115;
      auVar106._12_4_ = local_500 * fVar116;
      auVar106._16_4_ = local_500 * fVar117;
      auVar106._20_4_ = local_500 * fVar192;
      auVar106._24_4_ = local_500 * fVar194;
      auVar106._28_4_ = auVar95._4_4_;
      auVar24._4_4_ = fVar111 * fVar114;
      auVar24._0_4_ = fVar138 * fVar112;
      auVar24._8_4_ = fVar138 * fVar115;
      auVar24._12_4_ = fVar111 * fVar116;
      auVar24._16_4_ = fVar138 * fVar117;
      auVar24._20_4_ = fVar111 * fVar192;
      auVar24._24_4_ = fVar138 * fVar194;
      auVar24._28_4_ = local_500;
      auVar25._4_4_ = fVar114 * fVar191;
      auVar25._0_4_ = fVar112 * fVar187;
      auVar25._8_4_ = fVar115 * fVar187;
      auVar25._12_4_ = fVar116 * fVar191;
      auVar25._16_4_ = fVar117 * fVar187;
      auVar25._20_4_ = fVar192 * fVar191;
      auVar25._24_4_ = fVar194 * fVar187;
      auVar25._28_4_ = fVar111;
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x1b18);
      auVar95 = vfmadd231ps_fma(auVar106,auVar98,local_6e0);
      auVar159 = vfmadd231ps_fma(auVar24,auVar98,local_620);
      auVar93 = vfmadd231ps_fma(auVar25,auVar189,auVar98);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x1694);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar98,auVar188);
      auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar98,local_580);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_240,auVar98);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x1210);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar98,auVar154);
      auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar98,local_600);
      auVar124._8_4_ = 0x7fffffff;
      auVar124._0_8_ = 0x7fffffff7fffffff;
      auVar124._12_4_ = 0x7fffffff;
      auVar124._16_4_ = 0x7fffffff;
      auVar124._20_4_ = 0x7fffffff;
      auVar124._24_4_ = 0x7fffffff;
      auVar124._28_4_ = 0x7fffffff;
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_760,auVar98);
      auVar98 = vandps_avx(ZEXT1632(auVar139),auVar124);
      auVar121 = vandps_avx(ZEXT1632(auVar120),auVar124);
      auVar121 = vmaxps_avx(auVar98,auVar121);
      auVar98 = vandps_avx(ZEXT1632(auVar151),auVar124);
      auVar98 = vmaxps_avx(auVar121,auVar98);
      auVar148._4_4_ = fVar110;
      auVar148._0_4_ = fVar110;
      auVar148._8_4_ = fVar110;
      auVar148._12_4_ = fVar110;
      auVar148._16_4_ = fVar110;
      auVar148._20_4_ = fVar110;
      auVar148._24_4_ = fVar110;
      auVar148._28_4_ = fVar110;
      auVar98 = vcmpps_avx(auVar98,auVar148,1);
      auVar106 = vblendvps_avx(ZEXT1632(auVar139),local_520,auVar98);
      auVar107 = vblendvps_avx(ZEXT1632(auVar120),local_460,auVar98);
      auVar98 = vandps_avx(ZEXT1632(auVar95),auVar124);
      auVar121 = vandps_avx(ZEXT1632(auVar159),auVar124);
      auVar99 = vmaxps_avx(auVar98,auVar121);
      auVar98 = vandps_avx(ZEXT1632(auVar93),auVar124);
      auVar98 = vmaxps_avx(auVar99,auVar98);
      auVar171 = vcmpps_avx(auVar98,auVar148,1);
      auVar98 = vblendvps_avx(ZEXT1632(auVar95),local_520,auVar171);
      auVar99 = vblendvps_avx(ZEXT1632(auVar159),local_460,auVar171);
      auVar96 = vfmadd213ps_fma(auVar175,local_760,ZEXT1632(auVar96));
      auVar95 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar107,auVar107);
      auVar175 = vrsqrtps_avx(ZEXT1632(auVar95));
      fVar138 = auVar175._0_4_;
      fVar111 = auVar175._4_4_;
      fVar112 = auVar175._8_4_;
      fVar114 = auVar175._12_4_;
      fVar115 = auVar175._16_4_;
      fVar116 = auVar175._20_4_;
      fVar117 = auVar175._24_4_;
      auVar26._4_4_ = fVar111 * fVar111 * fVar111 * auVar95._4_4_ * -0.5;
      auVar26._0_4_ = fVar138 * fVar138 * fVar138 * auVar95._0_4_ * -0.5;
      auVar26._8_4_ = fVar112 * fVar112 * fVar112 * auVar95._8_4_ * -0.5;
      auVar26._12_4_ = fVar114 * fVar114 * fVar114 * auVar95._12_4_ * -0.5;
      auVar26._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar26._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
      auVar26._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar26._28_4_ = auVar121._28_4_;
      auVar232._8_4_ = 0x3fc00000;
      auVar232._0_8_ = 0x3fc000003fc00000;
      auVar232._12_4_ = 0x3fc00000;
      auVar232._16_4_ = 0x3fc00000;
      auVar232._20_4_ = 0x3fc00000;
      auVar232._24_4_ = 0x3fc00000;
      auVar232._28_4_ = 0x3fc00000;
      auVar95 = vfmadd231ps_fma(auVar26,auVar232,auVar175);
      fVar138 = auVar95._0_4_;
      fVar111 = auVar95._4_4_;
      auVar27._4_4_ = fVar111 * auVar107._4_4_;
      auVar27._0_4_ = fVar138 * auVar107._0_4_;
      fVar112 = auVar95._8_4_;
      auVar27._8_4_ = fVar112 * auVar107._8_4_;
      fVar114 = auVar95._12_4_;
      auVar27._12_4_ = fVar114 * auVar107._12_4_;
      auVar27._16_4_ = auVar107._16_4_ * 0.0;
      auVar27._20_4_ = auVar107._20_4_ * 0.0;
      auVar27._24_4_ = auVar107._24_4_ * 0.0;
      auVar27._28_4_ = 0;
      auVar28._4_4_ = fVar111 * -auVar106._4_4_;
      auVar28._0_4_ = fVar138 * -auVar106._0_4_;
      auVar28._8_4_ = fVar112 * -auVar106._8_4_;
      auVar28._12_4_ = fVar114 * -auVar106._12_4_;
      auVar28._16_4_ = -auVar106._16_4_ * 0.0;
      auVar28._20_4_ = -auVar106._20_4_ * 0.0;
      auVar28._24_4_ = -auVar106._24_4_ * 0.0;
      auVar28._28_4_ = auVar175._28_4_;
      auVar95 = vfmadd213ps_fma(auVar98,auVar98,ZEXT832(0) << 0x20);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar99,auVar99);
      auVar121 = vrsqrtps_avx(ZEXT1632(auVar95));
      auVar29._28_4_ = auVar171._28_4_;
      auVar29._0_28_ =
           ZEXT1628(CONCAT412(fVar114 * 0.0,
                              CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar138 * 0.0))));
      fVar138 = auVar121._0_4_;
      fVar111 = auVar121._4_4_;
      fVar112 = auVar121._8_4_;
      fVar114 = auVar121._12_4_;
      fVar115 = auVar121._16_4_;
      fVar116 = auVar121._20_4_;
      fVar117 = auVar121._24_4_;
      auVar30._4_4_ = fVar111 * fVar111 * fVar111 * auVar95._4_4_ * -0.5;
      auVar30._0_4_ = fVar138 * fVar138 * fVar138 * auVar95._0_4_ * -0.5;
      auVar30._8_4_ = fVar112 * fVar112 * fVar112 * auVar95._8_4_ * -0.5;
      auVar30._12_4_ = fVar114 * fVar114 * fVar114 * auVar95._12_4_ * -0.5;
      auVar30._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar30._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
      auVar30._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar30._28_4_ = 0;
      auVar95 = vfmadd231ps_fma(auVar30,auVar232,auVar121);
      fVar138 = auVar95._0_4_;
      auVar218._0_4_ = auVar99._0_4_ * fVar138;
      fVar111 = auVar95._4_4_;
      auVar218._4_4_ = auVar99._4_4_ * fVar111;
      fVar112 = auVar95._8_4_;
      auVar218._8_4_ = auVar99._8_4_ * fVar112;
      fVar114 = auVar95._12_4_;
      auVar218._12_4_ = auVar99._12_4_ * fVar114;
      auVar218._16_4_ = auVar99._16_4_ * 0.0;
      auVar218._20_4_ = auVar99._20_4_ * 0.0;
      auVar218._24_4_ = auVar99._24_4_ * 0.0;
      auVar218._28_4_ = 0;
      auVar31._4_4_ = -auVar98._4_4_ * fVar111;
      auVar31._0_4_ = -auVar98._0_4_ * fVar138;
      auVar31._8_4_ = -auVar98._8_4_ * fVar112;
      auVar31._12_4_ = -auVar98._12_4_ * fVar114;
      auVar31._16_4_ = -auVar98._16_4_ * 0.0;
      auVar31._20_4_ = -auVar98._20_4_ * 0.0;
      auVar31._24_4_ = -auVar98._24_4_ * 0.0;
      auVar31._28_4_ = auVar99._28_4_;
      auVar32._28_4_ = auVar121._28_4_;
      auVar32._0_28_ =
           ZEXT1628(CONCAT412(fVar114 * 0.0,
                              CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar138 * 0.0))));
      auVar95 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar119),auVar122);
      auVar98 = ZEXT1632(auVar119);
      auVar139 = vfmadd213ps_fma(auVar28,auVar98,local_440);
      auVar120 = vfmadd213ps_fma(auVar29,auVar98,ZEXT1632(auVar96));
      auVar93 = vfnmadd213ps_fma(auVar27,auVar98,auVar122);
      auVar151 = vfmadd213ps_fma(auVar218,ZEXT1632(auVar94),local_400);
      auVar118 = vfnmadd213ps_fma(auVar28,auVar98,local_440);
      auVar98 = ZEXT1632(auVar94);
      auVar159 = vfmadd213ps_fma(auVar31,auVar98,local_420);
      auVar179 = ZEXT1632(auVar119);
      auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar96),auVar179,auVar29);
      auVar96 = vfmadd213ps_fma(auVar32,auVar98,ZEXT1632(auVar17));
      auVar158 = vfnmadd213ps_fma(auVar218,auVar98,local_400);
      auVar164 = vfnmadd213ps_fma(auVar31,auVar98,local_420);
      _local_5a0 = ZEXT1632(auVar94);
      auVar166 = vfnmadd231ps_fma(ZEXT1632(auVar17),_local_5a0,auVar32);
      auVar98 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar118));
      auVar121 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar165));
      auVar122._4_4_ = auVar165._4_4_ * auVar98._4_4_;
      auVar122._0_4_ = auVar165._0_4_ * auVar98._0_4_;
      auVar122._8_4_ = auVar165._8_4_ * auVar98._8_4_;
      auVar122._12_4_ = auVar165._12_4_ * auVar98._12_4_;
      auVar122._16_4_ = auVar98._16_4_ * 0.0;
      auVar122._20_4_ = auVar98._20_4_ * 0.0;
      auVar122._24_4_ = auVar98._24_4_ * 0.0;
      auVar122._28_4_ = 0;
      auVar119 = vfmsub231ps_fma(auVar122,ZEXT1632(auVar118),auVar121);
      auVar33._4_4_ = auVar121._4_4_ * auVar93._4_4_;
      auVar33._0_4_ = auVar121._0_4_ * auVar93._0_4_;
      auVar33._8_4_ = auVar121._8_4_ * auVar93._8_4_;
      auVar33._12_4_ = auVar121._12_4_ * auVar93._12_4_;
      auVar33._16_4_ = auVar121._16_4_ * 0.0;
      auVar33._20_4_ = auVar121._20_4_ * 0.0;
      auVar33._24_4_ = auVar121._24_4_ * 0.0;
      auVar33._28_4_ = auVar121._28_4_;
      auVar121 = vsubps_avx(ZEXT1632(auVar151),ZEXT1632(auVar93));
      auVar17 = vfmsub231ps_fma(auVar33,ZEXT1632(auVar165),auVar121);
      auVar34._4_4_ = auVar118._4_4_ * auVar121._4_4_;
      auVar34._0_4_ = auVar118._0_4_ * auVar121._0_4_;
      auVar34._8_4_ = auVar118._8_4_ * auVar121._8_4_;
      auVar34._12_4_ = auVar118._12_4_ * auVar121._12_4_;
      auVar34._16_4_ = auVar121._16_4_ * 0.0;
      auVar34._20_4_ = auVar121._20_4_ * 0.0;
      auVar34._24_4_ = auVar121._24_4_ * 0.0;
      auVar34._28_4_ = auVar121._28_4_;
      auVar171 = ZEXT1632(auVar93);
      auVar94 = vfmsub231ps_fma(auVar34,auVar171,auVar98);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar119));
      auVar129 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
      auVar98 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar95),auVar129);
      auVar121 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar139),auVar129);
      auVar175 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar120),auVar129);
      auVar106 = vblendvps_avx(auVar171,ZEXT1632(auVar151),auVar129);
      auVar107 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar159),auVar129);
      auVar99 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar96),auVar129);
      auVar171 = vblendvps_avx(ZEXT1632(auVar151),auVar171,auVar129);
      auVar100 = vblendvps_avx(ZEXT1632(auVar159),ZEXT1632(auVar118),auVar129);
      auVar17 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
      auVar19 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar165),auVar129);
      auVar181 = vsubps_avx(auVar171,auVar98);
      auVar220 = vsubps_avx(auVar100,auVar121);
      auVar101 = vsubps_avx(auVar19,auVar175);
      auVar122 = vsubps_avx(auVar98,auVar106);
      auVar123 = vsubps_avx(auVar121,auVar107);
      auVar18 = vsubps_avx(auVar175,auVar99);
      auVar35._4_4_ = auVar101._4_4_ * auVar98._4_4_;
      auVar35._0_4_ = auVar101._0_4_ * auVar98._0_4_;
      auVar35._8_4_ = auVar101._8_4_ * auVar98._8_4_;
      auVar35._12_4_ = auVar101._12_4_ * auVar98._12_4_;
      auVar35._16_4_ = auVar101._16_4_ * auVar98._16_4_;
      auVar35._20_4_ = auVar101._20_4_ * auVar98._20_4_;
      auVar35._24_4_ = auVar101._24_4_ * auVar98._24_4_;
      auVar35._28_4_ = auVar19._28_4_;
      auVar96 = vfmsub231ps_fma(auVar35,auVar175,auVar181);
      auVar36._4_4_ = auVar181._4_4_ * auVar121._4_4_;
      auVar36._0_4_ = auVar181._0_4_ * auVar121._0_4_;
      auVar36._8_4_ = auVar181._8_4_ * auVar121._8_4_;
      auVar36._12_4_ = auVar181._12_4_ * auVar121._12_4_;
      auVar36._16_4_ = auVar181._16_4_ * auVar121._16_4_;
      auVar36._20_4_ = auVar181._20_4_ * auVar121._20_4_;
      auVar36._24_4_ = auVar181._24_4_ * auVar121._24_4_;
      auVar36._28_4_ = auVar171._28_4_;
      auVar95 = vfmsub231ps_fma(auVar36,auVar98,auVar220);
      auVar74 = ZEXT812(0);
      auVar219 = ZEXT1232(auVar74) << 0x20;
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1232(auVar74) << 0x20,ZEXT1632(auVar96));
      auVar103._0_4_ = auVar220._0_4_ * auVar175._0_4_;
      auVar103._4_4_ = auVar220._4_4_ * auVar175._4_4_;
      auVar103._8_4_ = auVar220._8_4_ * auVar175._8_4_;
      auVar103._12_4_ = auVar220._12_4_ * auVar175._12_4_;
      auVar103._16_4_ = auVar220._16_4_ * auVar175._16_4_;
      auVar103._20_4_ = auVar220._20_4_ * auVar175._20_4_;
      auVar103._24_4_ = auVar220._24_4_ * auVar175._24_4_;
      auVar103._28_4_ = 0;
      auVar95 = vfmsub231ps_fma(auVar103,auVar121,auVar101);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1232(auVar74) << 0x20,ZEXT1632(auVar95));
      auVar104._0_4_ = auVar18._0_4_ * auVar106._0_4_;
      auVar104._4_4_ = auVar18._4_4_ * auVar106._4_4_;
      auVar104._8_4_ = auVar18._8_4_ * auVar106._8_4_;
      auVar104._12_4_ = auVar18._12_4_ * auVar106._12_4_;
      auVar104._16_4_ = auVar18._16_4_ * auVar106._16_4_;
      auVar104._20_4_ = auVar18._20_4_ * auVar106._20_4_;
      auVar104._24_4_ = auVar18._24_4_ * auVar106._24_4_;
      auVar104._28_4_ = 0;
      auVar96 = vfmsub231ps_fma(auVar104,auVar122,auVar99);
      auVar37._4_4_ = auVar123._4_4_ * auVar99._4_4_;
      auVar37._0_4_ = auVar123._0_4_ * auVar99._0_4_;
      auVar37._8_4_ = auVar123._8_4_ * auVar99._8_4_;
      auVar37._12_4_ = auVar123._12_4_ * auVar99._12_4_;
      auVar37._16_4_ = auVar123._16_4_ * auVar99._16_4_;
      auVar37._20_4_ = auVar123._20_4_ * auVar99._20_4_;
      auVar37._24_4_ = auVar123._24_4_ * auVar99._24_4_;
      auVar37._28_4_ = auVar99._28_4_;
      auVar139 = vfmsub231ps_fma(auVar37,auVar107,auVar18);
      auVar38._4_4_ = auVar122._4_4_ * auVar107._4_4_;
      auVar38._0_4_ = auVar122._0_4_ * auVar107._0_4_;
      auVar38._8_4_ = auVar122._8_4_ * auVar107._8_4_;
      auVar38._12_4_ = auVar122._12_4_ * auVar107._12_4_;
      auVar38._16_4_ = auVar122._16_4_ * auVar107._16_4_;
      auVar38._20_4_ = auVar122._20_4_ * auVar107._20_4_;
      auVar38._24_4_ = auVar122._24_4_ * auVar107._24_4_;
      auVar38._28_4_ = auVar100._28_4_;
      auVar119 = vfmsub231ps_fma(auVar38,auVar123,auVar106);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar119),ZEXT1232(auVar74) << 0x20,ZEXT1632(auVar96));
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1232(auVar74) << 0x20,ZEXT1632(auVar139));
      auVar106 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar139));
      auVar106 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,2);
      auVar96 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
      auVar17 = vpand_avx(auVar96,auVar17);
      auVar106 = vpmovsxwd_avx2(auVar17);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        auVar137 = ZEXT864(0) << 0x20;
LAB_01101678:
        auVar157 = ZEXT3264(CONCAT824(local_6a0[1]._24_8_,
                                      CONCAT816(local_6a0[1]._16_8_,
                                                CONCAT88(local_6a0[1]._8_8_,local_6a0[1]._0_8_))));
        auVar98 = vpcmpeqd_avx2(auVar219,auVar219);
        auVar206 = ZEXT3264(auVar98);
      }
      else {
        auVar39._4_4_ = auVar220._4_4_ * auVar18._4_4_;
        auVar39._0_4_ = auVar220._0_4_ * auVar18._0_4_;
        auVar39._8_4_ = auVar220._8_4_ * auVar18._8_4_;
        auVar39._12_4_ = auVar220._12_4_ * auVar18._12_4_;
        auVar39._16_4_ = auVar220._16_4_ * auVar18._16_4_;
        auVar39._20_4_ = auVar220._20_4_ * auVar18._20_4_;
        auVar39._24_4_ = auVar220._24_4_ * auVar18._24_4_;
        auVar39._28_4_ = auVar106._28_4_;
        auVar120 = vfmsub231ps_fma(auVar39,auVar123,auVar101);
        auVar125._0_4_ = auVar101._0_4_ * auVar122._0_4_;
        auVar125._4_4_ = auVar101._4_4_ * auVar122._4_4_;
        auVar125._8_4_ = auVar101._8_4_ * auVar122._8_4_;
        auVar125._12_4_ = auVar101._12_4_ * auVar122._12_4_;
        auVar125._16_4_ = auVar101._16_4_ * auVar122._16_4_;
        auVar125._20_4_ = auVar101._20_4_ * auVar122._20_4_;
        auVar125._24_4_ = auVar101._24_4_ * auVar122._24_4_;
        auVar125._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar125,auVar181,auVar18);
        auVar40._4_4_ = auVar181._4_4_ * auVar123._4_4_;
        auVar40._0_4_ = auVar181._0_4_ * auVar123._0_4_;
        auVar40._8_4_ = auVar181._8_4_ * auVar123._8_4_;
        auVar40._12_4_ = auVar181._12_4_ * auVar123._12_4_;
        auVar40._16_4_ = auVar181._16_4_ * auVar123._16_4_;
        auVar40._20_4_ = auVar181._20_4_ * auVar123._20_4_;
        auVar40._24_4_ = auVar181._24_4_ * auVar123._24_4_;
        auVar40._28_4_ = auVar107._28_4_;
        auVar151 = vfmsub231ps_fma(auVar40,auVar122,auVar220);
        auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar151));
        auVar119 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar120),_DAT_01f7b000);
        auVar106 = vrcpps_avx(ZEXT1632(auVar119));
        auVar219._8_4_ = 0x3f800000;
        auVar219._0_8_ = 0x3f8000003f800000;
        auVar219._12_4_ = 0x3f800000;
        auVar219._16_4_ = 0x3f800000;
        auVar219._20_4_ = 0x3f800000;
        auVar219._24_4_ = 0x3f800000;
        auVar219._28_4_ = 0x3f800000;
        auVar96 = vfnmadd213ps_fma(auVar106,ZEXT1632(auVar119),auVar219);
        auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar106,auVar106);
        auVar180._0_4_ = auVar151._0_4_ * auVar175._0_4_;
        auVar180._4_4_ = auVar151._4_4_ * auVar175._4_4_;
        auVar180._8_4_ = auVar151._8_4_ * auVar175._8_4_;
        auVar180._12_4_ = auVar151._12_4_ * auVar175._12_4_;
        auVar180._16_4_ = auVar175._16_4_ * 0.0;
        auVar180._20_4_ = auVar175._20_4_ * 0.0;
        auVar180._24_4_ = auVar175._24_4_ * 0.0;
        auVar180._28_4_ = 0;
        auVar94 = vfmadd231ps_fma(auVar180,auVar121,ZEXT1632(auVar94));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar120),auVar98);
        fVar138 = auVar96._0_4_;
        fVar111 = auVar96._4_4_;
        fVar112 = auVar96._8_4_;
        fVar114 = auVar96._12_4_;
        auVar175 = ZEXT1632(CONCAT412(fVar114 * auVar94._12_4_,
                                      CONCAT48(fVar112 * auVar94._8_4_,
                                               CONCAT44(fVar111 * auVar94._4_4_,
                                                        fVar138 * auVar94._0_4_))));
        auVar105._4_4_ = uVar90;
        auVar105._0_4_ = uVar90;
        auVar105._8_4_ = uVar90;
        auVar105._12_4_ = uVar90;
        auVar105._16_4_ = uVar90;
        auVar105._20_4_ = uVar90;
        auVar105._24_4_ = uVar90;
        auVar105._28_4_ = uVar90;
        uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar126._4_4_ = uVar222;
        auVar126._0_4_ = uVar222;
        auVar126._8_4_ = uVar222;
        auVar126._12_4_ = uVar222;
        auVar126._16_4_ = uVar222;
        auVar126._20_4_ = uVar222;
        auVar126._24_4_ = uVar222;
        auVar126._28_4_ = uVar222;
        auVar98 = vcmpps_avx(auVar105,auVar175,2);
        auVar121 = vcmpps_avx(auVar175,auVar126,2);
        auVar98 = vandps_avx(auVar121,auVar98);
        auVar96 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar17 = vpand_avx(auVar17,auVar96);
        auVar98 = vpmovsxwd_avx2(auVar17);
        auVar137 = ZEXT864(0) << 0x20;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar98[0x1f]) goto LAB_01101678;
        auVar98 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar119),4);
        auVar96 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar17 = vpand_avx(auVar17,auVar96);
        auVar121 = vpmovsxwd_avx2(auVar17);
        auVar157 = ZEXT3264(CONCAT824(local_6a0[1]._24_8_,
                                      CONCAT816(local_6a0[1]._16_8_,
                                                CONCAT88(local_6a0[1]._8_8_,local_6a0[1]._0_8_))));
        auVar98 = vpcmpeqd_avx2(auVar219,auVar219);
        auVar206 = ZEXT3264(auVar98);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar106 = ZEXT1632(CONCAT412(fVar114 * auVar95._12_4_,
                                        CONCAT48(fVar112 * auVar95._8_4_,
                                                 CONCAT44(fVar111 * auVar95._4_4_,
                                                          fVar138 * auVar95._0_4_))));
          auVar107 = ZEXT1632(CONCAT412(fVar114 * auVar139._12_4_,
                                        CONCAT48(fVar112 * auVar139._8_4_,
                                                 CONCAT44(fVar111 * auVar139._4_4_,
                                                          fVar138 * auVar139._0_4_))));
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = 0x3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar163._16_4_ = 0x3f800000;
          auVar163._20_4_ = 0x3f800000;
          auVar163._24_4_ = 0x3f800000;
          auVar163._28_4_ = 0x3f800000;
          auVar98 = vsubps_avx(auVar163,auVar106);
          _local_260 = vblendvps_avx(auVar98,auVar106,auVar129);
          auVar98 = vsubps_avx(auVar163,auVar107);
          local_4c0 = vblendvps_avx(auVar98,auVar107,auVar129);
          auVar157 = ZEXT3264(auVar121);
          local_5c0 = auVar175;
        }
      }
      auVar229 = ZEXT3264(local_760);
      auVar227 = ZEXT3264(_local_7e0);
      auVar98 = auVar157._0_32_;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar157 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar157 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar157[0x1f]) {
        auVar137 = ZEXT3264(local_780);
        auVar157 = ZEXT3264(local_6e0);
      }
      else {
        auVar121 = vsubps_avx(_local_5a0,auVar179);
        auVar17 = vfmadd213ps_fma(auVar121,_local_260,auVar179);
        fVar138 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar41._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar138;
        auVar41._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar138;
        auVar41._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar138;
        auVar41._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar138;
        auVar41._16_4_ = fVar138 * 0.0;
        auVar41._20_4_ = fVar138 * 0.0;
        auVar41._24_4_ = fVar138 * 0.0;
        auVar41._28_4_ = 0;
        auVar121 = vcmpps_avx(local_5c0,auVar41,6);
        auVar175 = auVar98 & auVar121;
        auVar157 = ZEXT3264(auVar189);
        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar175 >> 0x7f,0) != '\0') ||
              (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar175 >> 0xbf,0) != '\0') ||
            (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar175[0x1f] < '\0') {
          auVar127._8_4_ = 0xbf800000;
          auVar127._0_8_ = 0xbf800000bf800000;
          auVar127._12_4_ = 0xbf800000;
          auVar127._16_4_ = 0xbf800000;
          auVar127._20_4_ = 0xbf800000;
          auVar127._24_4_ = 0xbf800000;
          auVar127._28_4_ = 0xbf800000;
          auVar149._8_4_ = 0x40000000;
          auVar149._0_8_ = 0x4000000040000000;
          auVar149._12_4_ = 0x40000000;
          auVar149._16_4_ = 0x40000000;
          auVar149._20_4_ = 0x40000000;
          auVar149._24_4_ = 0x40000000;
          auVar149._28_4_ = 0x40000000;
          auVar17 = vfmadd213ps_fma(local_4c0,auVar149,auVar127);
          local_3c0 = _local_260;
          local_3a0 = ZEXT1632(auVar17);
          local_380 = local_5c0;
          local_360 = 0;
          local_340 = local_870;
          uStack_338 = uStack_868;
          local_330 = local_880;
          uStack_328 = uStack_878;
          local_320 = local_890;
          uStack_318 = uStack_888;
          local_4c0 = local_3a0;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_6c0 = vandps_avx(auVar121,auVar98);
            fVar138 = 1.0 / (float)local_540._0_4_;
            local_2e0[0] = fVar138 * ((float)local_260._0_4_ + 0.0);
            local_2e0[1] = fVar138 * ((float)local_260._4_4_ + 1.0);
            local_2e0[2] = fVar138 * (fStack_258 + 2.0);
            local_2e0[3] = fVar138 * (fStack_254 + 3.0);
            fStack_2d0 = fVar138 * (fStack_250 + 4.0);
            fStack_2cc = fVar138 * (fStack_24c + 5.0);
            fStack_2c8 = fVar138 * (fStack_248 + 6.0);
            fStack_2c4 = fStack_244 + 7.0;
            local_4c0._0_8_ = auVar17._0_8_;
            local_4c0._8_8_ = auVar17._8_8_;
            local_2c0 = local_4c0._0_8_;
            uStack_2b8 = local_4c0._8_8_;
            uStack_2b0 = 0;
            uStack_2a8 = 0;
            local_2a0 = local_5c0;
            auVar128._8_4_ = 0x7f800000;
            auVar128._0_8_ = 0x7f8000007f800000;
            auVar128._12_4_ = 0x7f800000;
            auVar128._16_4_ = 0x7f800000;
            auVar128._20_4_ = 0x7f800000;
            auVar128._24_4_ = 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar128,local_5c0,local_6c0);
            auVar121 = vshufps_avx(auVar98,auVar98,0xb1);
            auVar121 = vminps_avx(auVar98,auVar121);
            auVar175 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar175);
            auVar175 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar175);
            auVar121 = vcmpps_avx(auVar98,auVar121,0);
            auVar175 = local_6c0 & auVar121;
            auVar98 = local_6c0;
            if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar175 >> 0x7f,0) != '\0') ||
                  (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0xbf,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar175[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar121,local_6c0);
            }
            uVar84 = vmovmskps_avx(auVar98);
            uVar20 = 0;
            for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              uVar20 = uVar20 + 1;
            }
            uVar86 = (ulong)uVar20;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar138 = local_2e0[uVar86];
              uVar222 = *(undefined4 *)((long)&local_2c0 + uVar86 * 4);
              fVar112 = 1.0 - fVar138;
              fVar111 = fVar112 * fVar112 * -3.0;
              auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 * fVar112)),
                                        ZEXT416((uint)(fVar138 * fVar112)),ZEXT416(0xc0000000));
              auVar17 = vfmsub132ss_fma(ZEXT416((uint)(fVar138 * fVar112)),
                                        ZEXT416((uint)(fVar138 * fVar138)),ZEXT416(0x40000000));
              fVar112 = auVar12._0_4_ * 3.0;
              fVar114 = auVar17._0_4_ * 3.0;
              fVar115 = fVar138 * fVar138 * 3.0;
              auVar167._0_4_ = fVar115 * fVar113;
              auVar167._4_4_ = fVar115 * fVar75;
              auVar167._8_4_ = fVar115 * fVar76;
              auVar167._12_4_ = fVar115 * fVar77;
              auVar140._4_4_ = fVar114;
              auVar140._0_4_ = fVar114;
              auVar140._8_4_ = fVar114;
              auVar140._12_4_ = fVar114;
              auVar12 = vfmadd132ps_fma(auVar140,auVar167,auVar16);
              auVar152._4_4_ = fVar112;
              auVar152._0_4_ = fVar112;
              auVar152._8_4_ = fVar112;
              auVar152._12_4_ = fVar112;
              auVar12 = vfmadd132ps_fma(auVar152,auVar12,auVar15);
              auVar141._4_4_ = fVar111;
              auVar141._0_4_ = fVar111;
              auVar141._8_4_ = fVar111;
              auVar141._12_4_ = fVar111;
              auVar12 = vfmadd132ps_fma(auVar141,auVar12,*(undefined1 (*) [16])pPVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar86 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
              uVar8 = vextractps_avx(auVar12,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
              uVar8 = vextractps_avx(auVar12,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
              *(float *)(ray + k * 4 + 0x1e0) = fVar138;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar222;
              *(uint *)(ray + k * 4 + 0x220) = uVar83;
              *(uint *)(ray + k * 4 + 0x240) = uVar7;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_7c0._4_4_ = uVar7;
              local_7c0._0_4_ = uVar7;
              local_7c0._8_4_ = uVar7;
              local_7c0._12_4_ = uVar7;
              local_7c0._16_4_ = uVar7;
              local_7c0._20_4_ = uVar7;
              local_7c0._24_4_ = uVar7;
              local_7c0._28_4_ = uVar7;
              local_700._4_4_ = uVar83;
              local_700._0_4_ = uVar83;
              local_700._8_4_ = uVar83;
              local_700._12_4_ = uVar83;
              local_700._16_4_ = uVar83;
              local_700._20_4_ = uVar83;
              local_700._24_4_ = uVar83;
              local_700._28_4_ = uVar83;
              uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_740 = auVar189;
              _local_480 = *pauVar2;
              local_35c = iVar82;
              local_350 = uVar78;
              uStack_348 = uVar79;
              while( true ) {
                local_1c0 = local_2e0[uVar86];
                local_1a0 = *(undefined4 *)((long)&local_2c0 + uVar86 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar86 * 4);
                fVar112 = 1.0 - local_1c0;
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 * fVar112)),
                                          ZEXT416((uint)(local_1c0 * fVar112)),ZEXT416(0xc0000000));
                auVar17 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar112)),
                                          ZEXT416((uint)(local_1c0 * local_1c0)),ZEXT416(0x40000000)
                                         );
                fVar138 = auVar17._0_4_ * 3.0;
                fVar111 = local_1c0 * local_1c0 * 3.0;
                auVar170._0_4_ = fVar111 * fVar113;
                auVar170._4_4_ = fVar111 * fVar75;
                auVar170._8_4_ = fVar111 * fVar76;
                auVar170._12_4_ = fVar111 * fVar77;
                auVar146._4_4_ = fVar138;
                auVar146._0_4_ = fVar138;
                auVar146._8_4_ = fVar138;
                auVar146._12_4_ = fVar138;
                auVar17 = vfmadd132ps_fma(auVar146,auVar170,auVar16);
                fVar138 = auVar96._0_4_ * 3.0;
                auVar162._4_4_ = fVar138;
                auVar162._0_4_ = fVar138;
                auVar162._8_4_ = fVar138;
                auVar162._12_4_ = fVar138;
                auVar17 = vfmadd132ps_fma(auVar162,auVar17,auVar15);
                fVar138 = fVar112 * fVar112 * -3.0;
                local_810.context = context->user;
                auVar147._4_4_ = fVar138;
                auVar147._0_4_ = fVar138;
                auVar147._8_4_ = fVar138;
                auVar147._12_4_ = fVar138;
                auVar96 = vfmadd132ps_fma(auVar147,auVar17,auVar12);
                local_220 = auVar96._0_4_;
                uStack_21c = local_220;
                uStack_218 = local_220;
                uStack_214 = local_220;
                uStack_210 = local_220;
                uStack_20c = local_220;
                uStack_208 = local_220;
                uStack_204 = local_220;
                auVar17 = vmovshdup_avx(auVar96);
                local_200 = auVar17._0_8_;
                uStack_1f8 = local_200;
                uStack_1f0 = local_200;
                uStack_1e8 = local_200;
                auVar17 = vshufps_avx(auVar96,auVar96,0xaa);
                local_1e0 = auVar17._0_8_;
                uStack_1d8 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1c8 = local_1e0;
                fStack_1bc = local_1c0;
                fStack_1b8 = local_1c0;
                fStack_1b4 = local_1c0;
                fStack_1b0 = local_1c0;
                fStack_1ac = local_1c0;
                fStack_1a8 = local_1c0;
                fStack_1a4 = local_1c0;
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = local_700._0_8_;
                uStack_178 = local_700._8_8_;
                uStack_170 = local_700._16_8_;
                uStack_168 = local_700._24_8_;
                local_160 = local_7c0._0_8_;
                uStack_158 = local_7c0._8_8_;
                uStack_150 = local_7c0._16_8_;
                uStack_148 = local_7c0._24_8_;
                local_788[1] = auVar206._0_32_;
                *local_788 = auVar206._0_32_;
                local_140 = (local_810.context)->instID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_120 = (local_810.context)->instPrimID[0];
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                local_6a0[0] = local_280;
                local_810.valid = (int *)local_6a0;
                local_810.geometryUserPtr = *(void **)(CONCAT44(uStack_65c,local_660) + 0x18);
                local_810.hit = (RTCHitN *)&local_220;
                local_810.N = 8;
                pcVar11 = *(code **)(CONCAT44(uStack_65c,local_660) + 0x40);
                local_810.ray = (RTCRayN *)ray;
                if (pcVar11 != (code *)0x0) {
                  auVar98 = ZEXT1632(auVar206._0_16_);
                  (*pcVar11)(&local_810);
                  auVar227 = ZEXT3264(_local_7e0);
                  auVar157 = ZEXT3264(local_740);
                  auVar229 = ZEXT3264(local_760);
                  auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                  auVar206 = ZEXT3264(auVar98);
                  auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar121 = vpcmpeqd_avx2(auVar137._0_32_,local_6a0[0]);
                auVar98 = auVar206._0_32_ & ~auVar121;
                if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar98 >> 0x7f,0) == '\0') &&
                      (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar98 >> 0xbf,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar98[0x1f]) {
                  auVar121 = auVar206._0_32_ ^ auVar121;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_65c,local_660) + 0x3e) & 0x40) != 0)))) {
                    auVar98 = ZEXT1632(auVar206._0_16_);
                    (*p_Var10)(&local_810);
                    auVar227 = ZEXT3264(_local_7e0);
                    auVar157 = ZEXT3264(local_740);
                    auVar229 = ZEXT3264(local_760);
                    auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                    auVar206 = ZEXT3264(auVar98);
                    auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar175 = vpcmpeqd_avx2(auVar137._0_32_,local_6a0[0]);
                  auVar121 = auVar206._0_32_ ^ auVar175;
                  auVar98 = auVar206._0_32_ & ~auVar175;
                  if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0x7f,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar98 >> 0xbf,0) != '\0') ||
                      (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar98[0x1f] < '\0') {
                    auVar135._0_4_ = auVar206._0_4_ ^ auVar175._0_4_;
                    auVar135._4_4_ = auVar206._4_4_ ^ auVar175._4_4_;
                    auVar135._8_4_ = auVar206._8_4_ ^ auVar175._8_4_;
                    auVar135._12_4_ = auVar206._12_4_ ^ auVar175._12_4_;
                    auVar135._16_4_ = auVar206._16_4_ ^ auVar175._16_4_;
                    auVar135._20_4_ = auVar206._20_4_ ^ auVar175._20_4_;
                    auVar135._24_4_ = auVar206._24_4_ ^ auVar175._24_4_;
                    auVar135._28_4_ = auVar206._28_4_ ^ auVar175._28_4_;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])local_810.hit);
                    *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x20));
                    *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x40));
                    *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x60));
                    *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x80));
                    *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar98;
                  }
                }
                auVar98 = local_5c0;
                auVar189 = auVar157._0_32_;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar121 >> 0x7f,0) == '\0') &&
                      (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar121 >> 0xbf,0) == '\0') &&
                    (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar121[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar222;
                }
                else {
                  uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_6c0 + uVar86 * 4) = 0;
                auVar109._4_4_ = uVar222;
                auVar109._0_4_ = uVar222;
                auVar109._8_4_ = uVar222;
                auVar109._12_4_ = uVar222;
                auVar109._16_4_ = uVar222;
                auVar109._20_4_ = uVar222;
                auVar109._24_4_ = uVar222;
                auVar109._28_4_ = uVar222;
                auVar175 = vcmpps_avx(auVar98,auVar109,2);
                auVar121 = vandps_avx(auVar175,local_6c0);
                local_6c0 = local_6c0 & auVar175;
                if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                    (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_6c0[0x1f]) break;
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar98 = vblendvps_avx(auVar136,auVar98,auVar121);
                auVar175 = vshufps_avx(auVar98,auVar98,0xb1);
                auVar175 = vminps_avx(auVar98,auVar175);
                auVar106 = vshufpd_avx(auVar175,auVar175,5);
                auVar175 = vminps_avx(auVar175,auVar106);
                auVar106 = vpermpd_avx2(auVar175,0x4e);
                auVar175 = vminps_avx(auVar175,auVar106);
                auVar175 = vcmpps_avx(auVar98,auVar175,0);
                auVar106 = auVar121 & auVar175;
                auVar98 = auVar121;
                if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar106 >> 0x7f,0) != '\0') ||
                      (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0xbf,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar106[0x1f] < '\0') {
                  auVar98 = vandps_avx(auVar175,auVar121);
                }
                uVar84 = vmovmskps_avx(auVar98);
                uVar20 = 0;
                for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                  uVar20 = uVar20 + 1;
                }
                uVar86 = (ulong)uVar20;
                local_6c0 = auVar121;
              }
            }
          }
        }
        auVar137 = ZEXT3264(local_780);
        auVar157 = ZEXT3264(local_6e0);
      }
    }
    auVar221 = ZEXT3264(local_620);
    auVar206 = ZEXT3264(CONCAT428(fStack_4e4,
                                  CONCAT424(fStack_4e8,
                                            CONCAT420(fStack_4ec,
                                                      CONCAT416(fStack_4f0,
                                                                CONCAT412(fStack_4f4,
                                                                          CONCAT48(fStack_4f8,
                                                                                   CONCAT44(
                                                  fStack_4fc,local_500))))))));
    if (8 < iVar82) {
      local_440._4_4_ = iVar82;
      local_440._0_4_ = iVar82;
      local_440._8_4_ = iVar82;
      local_440._12_4_ = iVar82;
      local_440._16_4_ = iVar82;
      local_440._20_4_ = iVar82;
      local_440._24_4_ = iVar82;
      local_440._28_4_ = iVar82;
      local_4a0._4_4_ = fVar110;
      local_4a0._0_4_ = fVar110;
      fStack_498 = fVar110;
      fStack_494 = fVar110;
      fStack_490 = fVar110;
      fStack_48c = fVar110;
      fStack_488 = fVar110;
      fStack_484 = fVar110;
      local_100 = 1.0 / (float)local_540._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      local_540._4_4_ = local_640._0_4_;
      local_540._0_4_ = local_640._0_4_;
      uStack_538._0_4_ = local_640._0_4_;
      uStack_538._4_4_ = local_640._0_4_;
      uStack_530 = local_640._0_4_;
      uStack_52c = local_640._0_4_;
      uStack_528 = local_640._0_4_;
      uStack_524 = local_640._0_4_;
      local_560._4_4_ = local_560._0_4_;
      local_560._8_4_ = local_560._0_4_;
      local_560._12_4_ = local_560._0_4_;
      uStack_550 = local_560._0_4_;
      uStack_54c = local_560._0_4_;
      uStack_548 = local_560._0_4_;
      uStack_544 = local_560._0_4_;
      local_760 = auVar229._0_32_;
      _local_7e0 = auVar227._0_32_;
      fVar138 = (float)local_720;
      fVar110 = local_720._4_4_;
      fVar111 = (float)uStack_718;
      fVar112 = uStack_718._4_4_;
      fVar114 = (float)uStack_710;
      fVar115 = uStack_710._4_4_;
      fVar116 = (float)uStack_708;
      uVar222 = uStack_708._4_4_;
      local_740 = auVar189;
      local_660 = uVar90;
      uStack_65c = uVar90;
      uStack_658 = uVar90;
      uStack_654 = uVar90;
      uStack_650 = uVar90;
      uStack_64c = uVar90;
      uStack_648 = uVar90;
      uStack_644 = uVar90;
      for (lVar89 = 8; local_780 = auVar137._0_32_, lVar89 < iVar82; lVar89 = lVar89 + 8) {
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 * 4 + lVar88);
        auVar121 = *(undefined1 (*) [32])(lVar88 + 0x21fb768 + lVar89 * 4);
        auVar175 = *(undefined1 (*) [32])(lVar88 + 0x21fbbec + lVar89 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar88 + 0x21fc070 + lVar89 * 4);
        fVar117 = *(float *)*pauVar2;
        fVar192 = *(float *)(*pauVar2 + 4);
        fVar194 = *(float *)(*pauVar2 + 8);
        fVar196 = *(float *)(*pauVar2 + 0xc);
        fVar211 = *(float *)(*pauVar2 + 0x10);
        fVar213 = *(float *)(*pauVar2 + 0x14);
        fVar215 = *(float *)(*pauVar2 + 0x18);
        auVar81 = *(undefined1 (*) [28])*pauVar2;
        fVar200 = auVar206._0_4_;
        auVar228._0_4_ = fVar200 * fVar117;
        fVar207 = auVar206._4_4_;
        auVar228._4_4_ = fVar207 * fVar192;
        fVar208 = auVar206._8_4_;
        auVar228._8_4_ = fVar208 * fVar194;
        fVar209 = auVar206._12_4_;
        auVar228._12_4_ = fVar209 * fVar196;
        fVar210 = auVar206._16_4_;
        auVar228._16_4_ = fVar210 * fVar211;
        fVar212 = auVar206._20_4_;
        auVar228._20_4_ = fVar212 * fVar213;
        fVar214 = auVar206._24_4_;
        auVar228._28_36_ = auVar227._28_36_;
        auVar228._24_4_ = fVar214 * fVar215;
        auVar227._0_4_ = fVar117 * fVar138;
        auVar227._4_4_ = fVar192 * fVar110;
        auVar227._8_4_ = fVar194 * fVar111;
        auVar227._12_4_ = fVar196 * fVar112;
        auVar227._16_4_ = fVar211 * fVar114;
        auVar227._20_4_ = fVar213 * fVar115;
        auVar227._28_36_ = auVar229._28_36_;
        auVar227._24_4_ = fVar215 * fVar116;
        auVar12 = vfmadd231ps_fma(auVar228._0_32_,auVar175,auVar157._0_32_);
        auVar220 = auVar221._0_32_;
        auVar17 = vfmadd231ps_fma(auVar227._0_32_,auVar175,auVar220);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar121,auVar188);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar121,local_580);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar98,auVar154);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar98,local_600);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 * 4 + lVar88);
        auVar107 = *(undefined1 (*) [32])(lVar88 + 0x21fdb88 + lVar89 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar88 + 0x21fe00c + lVar89 * 4);
        pfVar3 = (float *)(lVar88 + 0x21fe490 + lVar89 * 4);
        fVar187 = *pfVar3;
        fVar191 = pfVar3[1];
        fVar193 = pfVar3[2];
        fVar195 = pfVar3[3];
        fVar197 = pfVar3[4];
        fVar198 = pfVar3[5];
        fVar199 = pfVar3[6];
        auVar42._4_4_ = fVar207 * fVar191;
        auVar42._0_4_ = fVar200 * fVar187;
        auVar42._8_4_ = fVar208 * fVar193;
        auVar42._12_4_ = fVar209 * fVar195;
        auVar42._16_4_ = fVar210 * fVar197;
        auVar42._20_4_ = fVar212 * fVar198;
        auVar42._24_4_ = fVar214 * fVar199;
        auVar42._28_4_ = auVar98._28_4_;
        auVar43._4_4_ = fVar110 * fVar191;
        auVar43._0_4_ = fVar138 * fVar187;
        auVar43._8_4_ = fVar111 * fVar193;
        auVar43._12_4_ = fVar112 * fVar195;
        auVar43._16_4_ = fVar114 * fVar197;
        auVar43._20_4_ = fVar115 * fVar198;
        auVar43._24_4_ = fVar116 * fVar199;
        auVar43._28_4_ = uVar222;
        auVar96 = vfmadd231ps_fma(auVar42,auVar99,auVar157._0_32_);
        auVar95 = vfmadd231ps_fma(auVar43,auVar99,auVar220);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar107,auVar188);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar107,local_580);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar106,auVar154);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,local_600);
        auVar181 = ZEXT1632(auVar96);
        local_700 = ZEXT1632(auVar12);
        local_400 = vsubps_avx(auVar181,local_700);
        auVar129 = ZEXT1632(auVar95);
        local_640 = ZEXT1632(auVar17);
        local_420 = vsubps_avx(auVar129,local_640);
        auVar44._4_4_ = auVar17._4_4_ * local_400._4_4_;
        auVar44._0_4_ = auVar17._0_4_ * local_400._0_4_;
        auVar44._8_4_ = auVar17._8_4_ * local_400._8_4_;
        auVar44._12_4_ = auVar17._12_4_ * local_400._12_4_;
        auVar44._16_4_ = local_400._16_4_ * 0.0;
        auVar44._20_4_ = local_400._20_4_ * 0.0;
        auVar44._24_4_ = local_400._24_4_ * 0.0;
        auVar44._28_4_ = local_600._28_4_;
        fVar138 = local_420._0_4_;
        auVar130._0_4_ = auVar12._0_4_ * fVar138;
        fVar110 = local_420._4_4_;
        auVar130._4_4_ = auVar12._4_4_ * fVar110;
        fVar111 = local_420._8_4_;
        auVar130._8_4_ = auVar12._8_4_ * fVar111;
        fVar112 = local_420._12_4_;
        auVar130._12_4_ = auVar12._12_4_ * fVar112;
        fVar114 = local_420._16_4_;
        auVar130._16_4_ = fVar114 * 0.0;
        fVar115 = local_420._20_4_;
        auVar130._20_4_ = fVar115 * 0.0;
        fVar116 = local_420._24_4_;
        auVar130._24_4_ = fVar116 * 0.0;
        auVar130._28_4_ = 0;
        auVar227 = ZEXT3264(auVar175);
        auVar100 = vsubps_avx(auVar44,auVar130);
        auVar45._4_4_ = local_e0._4_4_ * fVar192;
        auVar45._0_4_ = (float)local_e0 * fVar117;
        auVar45._8_4_ = (float)uStack_d8 * fVar194;
        auVar45._12_4_ = uStack_d8._4_4_ * fVar196;
        auVar45._16_4_ = (float)uStack_d0 * fVar211;
        auVar45._20_4_ = uStack_d0._4_4_ * fVar213;
        auVar45._24_4_ = (float)uStack_c8 * fVar215;
        auVar45._28_4_ = 0;
        auVar12 = vfmadd231ps_fma(auVar45,auVar175,local_c0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_a0,auVar121);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_80,auVar98);
        auVar46._4_4_ = local_e0._4_4_ * fVar191;
        auVar46._0_4_ = (float)local_e0 * fVar187;
        auVar46._8_4_ = (float)uStack_d8 * fVar193;
        auVar46._12_4_ = uStack_d8._4_4_ * fVar195;
        auVar46._16_4_ = (float)uStack_d0 * fVar197;
        auVar46._20_4_ = uStack_d0._4_4_ * fVar198;
        auVar46._24_4_ = (float)uStack_c8 * fVar199;
        auVar46._28_4_ = uStack_c8._4_4_;
        auVar17 = vfmadd231ps_fma(auVar46,auVar99,local_c0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,local_a0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar106,local_80);
        auVar229 = ZEXT1664(auVar17);
        auVar137._0_4_ = fVar138 * fVar138;
        auVar137._4_4_ = fVar110 * fVar110;
        auVar137._8_4_ = fVar111 * fVar111;
        auVar137._12_4_ = fVar112 * fVar112;
        auVar137._16_4_ = fVar114 * fVar114;
        auVar137._20_4_ = fVar115 * fVar115;
        auVar137._28_36_ = auVar206._28_36_;
        auVar137._24_4_ = fVar116 * fVar116;
        auVar96 = vfmadd231ps_fma(auVar137._0_32_,local_400,local_400);
        local_520 = ZEXT1632(auVar12);
        auVar101 = ZEXT1632(auVar17);
        auVar171 = vmaxps_avx(local_520,auVar101);
        auVar203._0_4_ = auVar171._0_4_ * auVar171._0_4_ * auVar96._0_4_;
        auVar203._4_4_ = auVar171._4_4_ * auVar171._4_4_ * auVar96._4_4_;
        auVar203._8_4_ = auVar171._8_4_ * auVar171._8_4_ * auVar96._8_4_;
        auVar203._12_4_ = auVar171._12_4_ * auVar171._12_4_ * auVar96._12_4_;
        auVar203._16_4_ = auVar171._16_4_ * auVar171._16_4_ * 0.0;
        auVar203._20_4_ = auVar171._20_4_ * auVar171._20_4_ * 0.0;
        auVar203._24_4_ = auVar171._24_4_ * auVar171._24_4_ * 0.0;
        auVar203._28_4_ = 0;
        auVar47._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar47._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar47._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar47._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar47._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar47._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar47._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar47._28_4_ = auVar100._28_4_;
        auVar171 = vcmpps_avx(auVar47,auVar203,2);
        local_360 = (int)lVar89;
        auVar204._4_4_ = local_360;
        auVar204._0_4_ = local_360;
        auVar204._8_4_ = local_360;
        auVar204._12_4_ = local_360;
        auVar204._16_4_ = local_360;
        auVar204._20_4_ = local_360;
        auVar204._24_4_ = local_360;
        auVar204._28_4_ = local_360;
        auVar100 = vpor_avx2(auVar204,_DAT_01fb4ba0);
        auVar19 = vpcmpgtd_avx2(local_440,auVar100);
        auVar100 = auVar19 & auVar171;
        fVar138 = (float)local_720;
        fVar110 = local_720._4_4_;
        fVar111 = (float)uStack_718;
        fVar112 = uStack_718._4_4_;
        fVar114 = (float)uStack_710;
        fVar115 = uStack_710._4_4_;
        fVar116 = (float)uStack_708;
        uVar222 = uStack_708._4_4_;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) {
          auVar137 = ZEXT3264(local_780);
          auVar221 = ZEXT3264(auVar220);
          auVar206 = ZEXT3264(auVar206._0_32_);
        }
        else {
          local_460 = vandps_avx(auVar19,auVar171);
          auVar48._4_4_ = (float)local_7e0._4_4_ * fVar191;
          auVar48._0_4_ = (float)local_7e0._0_4_ * fVar187;
          auVar48._8_4_ = fStack_7d8 * fVar193;
          auVar48._12_4_ = fStack_7d4 * fVar195;
          auVar48._16_4_ = fStack_7d0 * fVar197;
          auVar48._20_4_ = fStack_7cc * fVar198;
          auVar48._24_4_ = fStack_7c8 * fVar199;
          auVar48._28_4_ = auVar171._28_4_;
          auVar12 = vfmadd213ps_fma(auVar99,local_740,auVar48);
          auVar12 = vfmadd213ps_fma(auVar107,local_240,ZEXT1632(auVar12));
          auVar12 = vfmadd132ps_fma(auVar106,ZEXT1632(auVar12),local_760);
          _local_480 = ZEXT1632(auVar12);
          local_5a0._0_4_ = auVar81._0_4_;
          local_5a0._4_4_ = auVar81._4_4_;
          fStack_598 = auVar81._8_4_;
          fStack_594 = auVar81._12_4_;
          fStack_590 = auVar81._16_4_;
          fStack_58c = auVar81._20_4_;
          fStack_588 = auVar81._24_4_;
          auVar49._4_4_ = (float)local_7e0._4_4_ * (float)local_5a0._4_4_;
          auVar49._0_4_ = (float)local_7e0._0_4_ * (float)local_5a0._0_4_;
          auVar49._8_4_ = fStack_7d8 * fStack_598;
          auVar49._12_4_ = fStack_7d4 * fStack_594;
          auVar49._16_4_ = fStack_7d0 * fStack_590;
          auVar49._20_4_ = fStack_7cc * fStack_58c;
          auVar49._24_4_ = fStack_7c8 * fStack_588;
          auVar49._28_4_ = auVar171._28_4_;
          auVar12 = vfmadd213ps_fma(auVar175,local_740,auVar49);
          auVar12 = vfmadd213ps_fma(auVar121,local_240,ZEXT1632(auVar12));
          auVar121 = *(undefined1 (*) [32])(lVar88 + 0x21fc4f4 + lVar89 * 4);
          auVar175 = *(undefined1 (*) [32])(lVar88 + 0x21fc978 + lVar89 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar88 + 0x21fcdfc + lVar89 * 4);
          pfVar3 = (float *)(lVar88 + 0x21fd280 + lVar89 * 4);
          fVar117 = *pfVar3;
          fVar192 = pfVar3[1];
          fVar194 = pfVar3[2];
          fVar196 = pfVar3[3];
          fVar211 = pfVar3[4];
          fVar213 = pfVar3[5];
          fVar215 = pfVar3[6];
          auVar50._4_4_ = fVar207 * fVar192;
          auVar50._0_4_ = fVar200 * fVar117;
          auVar50._8_4_ = fVar208 * fVar194;
          auVar50._12_4_ = fVar209 * fVar196;
          auVar50._16_4_ = fVar210 * fVar211;
          auVar50._20_4_ = fVar212 * fVar213;
          auVar50._24_4_ = fVar214 * fVar215;
          auVar50._28_4_ = uStack_7c4;
          auVar225._0_4_ = fVar117 * (float)local_720;
          auVar225._4_4_ = fVar192 * local_720._4_4_;
          auVar225._8_4_ = fVar194 * (float)uStack_718;
          auVar225._12_4_ = fVar196 * uStack_718._4_4_;
          auVar225._16_4_ = fVar211 * (float)uStack_710;
          auVar225._20_4_ = fVar213 * uStack_710._4_4_;
          auVar225._24_4_ = fVar215 * (float)uStack_708;
          auVar225._28_4_ = 0;
          auVar51._4_4_ = fVar192 * (float)local_7e0._4_4_;
          auVar51._0_4_ = fVar117 * (float)local_7e0._0_4_;
          auVar51._8_4_ = fVar194 * fStack_7d8;
          auVar51._12_4_ = fVar196 * fStack_7d4;
          auVar51._16_4_ = fVar211 * fStack_7d0;
          auVar51._20_4_ = fVar213 * fStack_7cc;
          auVar51._24_4_ = fVar215 * fStack_7c8;
          auVar51._28_4_ = pfVar3[7];
          auVar17 = vfmadd231ps_fma(auVar50,auVar106,local_6e0);
          auVar96 = vfmadd231ps_fma(auVar225,auVar106,auVar220);
          auVar95 = vfmadd231ps_fma(auVar51,local_740,auVar106);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar175,auVar188);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar175,local_580);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_240,auVar175);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar121,auVar154);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar121,local_600);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_760,auVar121);
          pfVar3 = (float *)(lVar88 + 0x21ff6a0 + lVar89 * 4);
          fVar117 = *pfVar3;
          fVar192 = pfVar3[1];
          fVar194 = pfVar3[2];
          fVar196 = pfVar3[3];
          fVar211 = pfVar3[4];
          fVar213 = pfVar3[5];
          fVar215 = pfVar3[6];
          auVar52._4_4_ = fVar207 * fVar192;
          auVar52._0_4_ = fVar200 * fVar117;
          auVar52._8_4_ = fVar208 * fVar194;
          auVar52._12_4_ = fVar209 * fVar196;
          auVar52._16_4_ = fVar210 * fVar211;
          auVar52._20_4_ = fVar212 * fVar213;
          auVar52._24_4_ = fVar214 * fVar215;
          auVar52._28_4_ = auVar221._28_4_;
          auVar53._4_4_ = local_720._4_4_ * fVar192;
          auVar53._0_4_ = (float)local_720 * fVar117;
          auVar53._8_4_ = (float)uStack_718 * fVar194;
          auVar53._12_4_ = uStack_718._4_4_ * fVar196;
          auVar53._16_4_ = (float)uStack_710 * fVar211;
          auVar53._20_4_ = uStack_710._4_4_ * fVar213;
          auVar53._24_4_ = (float)uStack_708 * fVar215;
          auVar53._28_4_ = local_420._28_4_;
          auVar54._4_4_ = fVar192 * (float)local_7e0._4_4_;
          auVar54._0_4_ = fVar117 * (float)local_7e0._0_4_;
          auVar54._8_4_ = fVar194 * fStack_7d8;
          auVar54._12_4_ = fVar196 * fStack_7d4;
          auVar54._16_4_ = fVar211 * fStack_7d0;
          auVar54._20_4_ = fVar213 * fStack_7cc;
          auVar54._24_4_ = fVar215 * fStack_7c8;
          auVar54._28_4_ = pfVar3[7];
          auVar121 = *(undefined1 (*) [32])(lVar88 + 0x21ff21c + lVar89 * 4);
          auVar139 = vfmadd231ps_fma(auVar52,auVar121,local_6e0);
          auVar119 = vfmadd231ps_fma(auVar53,auVar121,auVar220);
          auVar94 = vfmadd231ps_fma(auVar54,auVar121,local_740);
          auVar121 = *(undefined1 (*) [32])(lVar88 + 0x21fed98 + lVar89 * 4);
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar121,auVar188);
          auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar121,local_580);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar121,local_240);
          auVar121 = *(undefined1 (*) [32])(lVar88 + 0x21fe914 + lVar89 * 4);
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar121,auVar154);
          auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar121,local_600);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_760,auVar121);
          auVar205._8_4_ = 0x7fffffff;
          auVar205._0_8_ = 0x7fffffff7fffffff;
          auVar205._12_4_ = 0x7fffffff;
          auVar205._16_4_ = 0x7fffffff;
          auVar205._20_4_ = 0x7fffffff;
          auVar205._24_4_ = 0x7fffffff;
          auVar205._28_4_ = 0x7fffffff;
          auVar121 = vandps_avx(ZEXT1632(auVar17),auVar205);
          auVar175 = vandps_avx(ZEXT1632(auVar96),auVar205);
          auVar175 = vmaxps_avx(auVar121,auVar175);
          auVar121 = vandps_avx(ZEXT1632(auVar95),auVar205);
          auVar121 = vmaxps_avx(auVar175,auVar121);
          auVar121 = vcmpps_avx(auVar121,_local_4a0,1);
          auVar106 = vblendvps_avx(ZEXT1632(auVar17),local_400,auVar121);
          auVar107 = vblendvps_avx(ZEXT1632(auVar96),local_420,auVar121);
          auVar121 = vandps_avx(ZEXT1632(auVar139),auVar205);
          auVar175 = vandps_avx(ZEXT1632(auVar119),auVar205);
          auVar175 = vmaxps_avx(auVar121,auVar175);
          auVar121 = vandps_avx(auVar205,ZEXT1632(auVar94));
          auVar121 = vmaxps_avx(auVar175,auVar121);
          auVar175 = vcmpps_avx(auVar121,_local_4a0,1);
          auVar121 = vblendvps_avx(ZEXT1632(auVar139),local_400,auVar175);
          auVar175 = vblendvps_avx(ZEXT1632(auVar119),local_420,auVar175);
          auVar12 = vfmadd213ps_fma(auVar98,local_760,ZEXT1632(auVar12));
          auVar17 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,auVar107);
          auVar98 = vrsqrtps_avx(ZEXT1632(auVar17));
          fVar117 = auVar98._0_4_;
          fVar192 = auVar98._4_4_;
          fVar194 = auVar98._8_4_;
          fVar196 = auVar98._12_4_;
          fVar211 = auVar98._16_4_;
          fVar213 = auVar98._20_4_;
          fVar215 = auVar98._24_4_;
          auVar55._4_4_ = fVar192 * fVar192 * fVar192 * auVar17._4_4_ * -0.5;
          auVar55._0_4_ = fVar117 * fVar117 * fVar117 * auVar17._0_4_ * -0.5;
          auVar55._8_4_ = fVar194 * fVar194 * fVar194 * auVar17._8_4_ * -0.5;
          auVar55._12_4_ = fVar196 * fVar196 * fVar196 * auVar17._12_4_ * -0.5;
          auVar55._16_4_ = fVar211 * fVar211 * fVar211 * -0.0;
          auVar55._20_4_ = fVar213 * fVar213 * fVar213 * -0.0;
          auVar55._24_4_ = fVar215 * fVar215 * fVar215 * -0.0;
          auVar55._28_4_ = 0;
          auVar233._8_4_ = 0x3fc00000;
          auVar233._0_8_ = 0x3fc000003fc00000;
          auVar233._12_4_ = 0x3fc00000;
          auVar233._16_4_ = 0x3fc00000;
          auVar233._20_4_ = 0x3fc00000;
          auVar233._24_4_ = 0x3fc00000;
          auVar233._28_4_ = 0x3fc00000;
          auVar17 = vfmadd231ps_fma(auVar55,auVar233,auVar98);
          fVar117 = auVar17._0_4_;
          fVar192 = auVar17._4_4_;
          auVar56._4_4_ = auVar107._4_4_ * fVar192;
          auVar56._0_4_ = auVar107._0_4_ * fVar117;
          fVar194 = auVar17._8_4_;
          auVar56._8_4_ = auVar107._8_4_ * fVar194;
          fVar196 = auVar17._12_4_;
          auVar56._12_4_ = auVar107._12_4_ * fVar196;
          auVar56._16_4_ = auVar107._16_4_ * 0.0;
          auVar56._20_4_ = auVar107._20_4_ * 0.0;
          auVar56._24_4_ = auVar107._24_4_ * 0.0;
          auVar56._28_4_ = auVar98._28_4_;
          auVar57._4_4_ = fVar192 * -auVar106._4_4_;
          auVar57._0_4_ = fVar117 * -auVar106._0_4_;
          auVar57._8_4_ = fVar194 * -auVar106._8_4_;
          auVar57._12_4_ = fVar196 * -auVar106._12_4_;
          auVar57._16_4_ = -auVar106._16_4_ * 0.0;
          auVar57._20_4_ = -auVar106._20_4_ * 0.0;
          auVar57._24_4_ = -auVar106._24_4_ * 0.0;
          auVar57._28_4_ = auVar107._28_4_;
          auVar17 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar175,auVar175);
          auVar98 = vrsqrtps_avx(ZEXT1632(auVar17));
          auVar58._28_4_ = local_400._28_4_;
          auVar58._0_28_ =
               ZEXT1628(CONCAT412(fVar196 * 0.0,
                                  CONCAT48(fVar194 * 0.0,CONCAT44(fVar192 * 0.0,fVar117 * 0.0))));
          fVar117 = auVar98._0_4_;
          fVar192 = auVar98._4_4_;
          fVar194 = auVar98._8_4_;
          fVar196 = auVar98._12_4_;
          fVar211 = auVar98._16_4_;
          fVar213 = auVar98._20_4_;
          fVar215 = auVar98._24_4_;
          auVar59._4_4_ = fVar192 * fVar192 * fVar192 * auVar17._4_4_ * -0.5;
          auVar59._0_4_ = fVar117 * fVar117 * fVar117 * auVar17._0_4_ * -0.5;
          auVar59._8_4_ = fVar194 * fVar194 * fVar194 * auVar17._8_4_ * -0.5;
          auVar59._12_4_ = fVar196 * fVar196 * fVar196 * auVar17._12_4_ * -0.5;
          auVar59._16_4_ = fVar211 * fVar211 * fVar211 * -0.0;
          auVar59._20_4_ = fVar213 * fVar213 * fVar213 * -0.0;
          auVar59._24_4_ = fVar215 * fVar215 * fVar215 * -0.0;
          auVar59._28_4_ = 0;
          auVar17 = vfmadd231ps_fma(auVar59,auVar233,auVar98);
          fVar117 = auVar17._0_4_;
          fVar192 = auVar17._4_4_;
          auVar60._4_4_ = auVar175._4_4_ * fVar192;
          auVar60._0_4_ = auVar175._0_4_ * fVar117;
          fVar194 = auVar17._8_4_;
          auVar60._8_4_ = auVar175._8_4_ * fVar194;
          fVar196 = auVar17._12_4_;
          auVar60._12_4_ = auVar175._12_4_ * fVar196;
          auVar60._16_4_ = auVar175._16_4_ * 0.0;
          auVar60._20_4_ = auVar175._20_4_ * 0.0;
          auVar60._24_4_ = auVar175._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar61._4_4_ = fVar192 * -auVar121._4_4_;
          auVar61._0_4_ = fVar117 * -auVar121._0_4_;
          auVar61._8_4_ = fVar194 * -auVar121._8_4_;
          auVar61._12_4_ = fVar196 * -auVar121._12_4_;
          auVar61._16_4_ = -auVar121._16_4_ * 0.0;
          auVar61._20_4_ = -auVar121._20_4_ * 0.0;
          auVar61._24_4_ = -auVar121._24_4_ * 0.0;
          auVar61._28_4_ = auVar98._28_4_;
          auVar62._28_4_ = 0xbf000000;
          auVar62._0_28_ =
               ZEXT1628(CONCAT412(fVar196 * 0.0,
                                  CONCAT48(fVar194 * 0.0,CONCAT44(fVar192 * 0.0,fVar117 * 0.0))));
          auVar17 = vfmadd213ps_fma(auVar56,local_520,local_700);
          auVar96 = vfmadd213ps_fma(auVar57,local_520,local_640);
          auVar95 = vfmadd213ps_fma(auVar58,local_520,ZEXT1632(auVar12));
          auVar151 = vfnmadd213ps_fma(auVar56,local_520,local_700);
          auVar139 = vfmadd213ps_fma(auVar60,auVar101,auVar181);
          auVar159 = vfnmadd213ps_fma(auVar57,local_520,local_640);
          auVar119 = vfmadd213ps_fma(auVar61,auVar101,auVar129);
          auVar12 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_520,auVar58);
          auVar94 = vfmadd213ps_fma(auVar62,auVar101,_local_480);
          auVar93 = vfnmadd213ps_fma(auVar60,auVar101,auVar181);
          auVar118 = vfnmadd213ps_fma(auVar61,auVar101,auVar129);
          auVar158 = vfnmadd231ps_fma(_local_480,auVar101,auVar62);
          auVar98 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar159));
          auVar121 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar12));
          auVar63._4_4_ = auVar98._4_4_ * auVar12._4_4_;
          auVar63._0_4_ = auVar98._0_4_ * auVar12._0_4_;
          auVar63._8_4_ = auVar98._8_4_ * auVar12._8_4_;
          auVar63._12_4_ = auVar98._12_4_ * auVar12._12_4_;
          auVar63._16_4_ = auVar98._16_4_ * 0.0;
          auVar63._20_4_ = auVar98._20_4_ * 0.0;
          auVar63._24_4_ = auVar98._24_4_ * 0.0;
          auVar63._28_4_ = 0;
          auVar120 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar159),auVar121);
          auVar64._4_4_ = auVar151._4_4_ * auVar121._4_4_;
          auVar64._0_4_ = auVar151._0_4_ * auVar121._0_4_;
          auVar64._8_4_ = auVar151._8_4_ * auVar121._8_4_;
          auVar64._12_4_ = auVar151._12_4_ * auVar121._12_4_;
          auVar64._16_4_ = auVar121._16_4_ * 0.0;
          auVar64._20_4_ = auVar121._20_4_ * 0.0;
          auVar64._24_4_ = auVar121._24_4_ * 0.0;
          auVar64._28_4_ = auVar121._28_4_;
          auVar99 = ZEXT1632(auVar151);
          auVar121 = vsubps_avx(ZEXT1632(auVar139),auVar99);
          auVar100 = ZEXT1632(auVar12);
          auVar12 = vfmsub231ps_fma(auVar64,auVar100,auVar121);
          auVar65._4_4_ = auVar159._4_4_ * auVar121._4_4_;
          auVar65._0_4_ = auVar159._0_4_ * auVar121._0_4_;
          auVar65._8_4_ = auVar159._8_4_ * auVar121._8_4_;
          auVar65._12_4_ = auVar159._12_4_ * auVar121._12_4_;
          auVar65._16_4_ = auVar121._16_4_ * 0.0;
          auVar65._20_4_ = auVar121._20_4_ * 0.0;
          auVar65._24_4_ = auVar121._24_4_ * 0.0;
          auVar65._28_4_ = auVar121._28_4_;
          auVar151 = vfmsub231ps_fma(auVar65,auVar99,auVar98);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar151),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar120));
          auVar19 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
          auVar98 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar17),auVar19);
          auVar121 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar96),auVar19);
          local_7c0 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar95),auVar19);
          auVar175 = vblendvps_avx(auVar99,ZEXT1632(auVar139),auVar19);
          auVar106 = vblendvps_avx(ZEXT1632(auVar159),ZEXT1632(auVar119),auVar19);
          auVar107 = vblendvps_avx(auVar100,ZEXT1632(auVar94),auVar19);
          auVar99 = vblendvps_avx(ZEXT1632(auVar139),auVar99,auVar19);
          auVar171 = vblendvps_avx(ZEXT1632(auVar119),ZEXT1632(auVar159),auVar19);
          auVar12 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
          auVar100 = vblendvps_avx(ZEXT1632(auVar94),auVar100,auVar19);
          auVar99 = vsubps_avx(auVar99,auVar98);
          auVar171 = vsubps_avx(auVar171,auVar121);
          auVar129 = vsubps_avx(auVar100,local_7c0);
          auVar227 = ZEXT3264(auVar129);
          auVar181 = vsubps_avx(auVar98,auVar175);
          auVar220 = vsubps_avx(auVar121,auVar106);
          auVar122 = vsubps_avx(local_7c0,auVar107);
          auVar229 = ZEXT3264(auVar122);
          auVar172._0_4_ = auVar129._0_4_ * auVar98._0_4_;
          auVar172._4_4_ = auVar129._4_4_ * auVar98._4_4_;
          auVar172._8_4_ = auVar129._8_4_ * auVar98._8_4_;
          auVar172._12_4_ = auVar129._12_4_ * auVar98._12_4_;
          auVar172._16_4_ = auVar129._16_4_ * auVar98._16_4_;
          auVar172._20_4_ = auVar129._20_4_ * auVar98._20_4_;
          auVar172._24_4_ = auVar129._24_4_ * auVar98._24_4_;
          auVar172._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar172,local_7c0,auVar99);
          auVar66._4_4_ = auVar99._4_4_ * auVar121._4_4_;
          auVar66._0_4_ = auVar99._0_4_ * auVar121._0_4_;
          auVar66._8_4_ = auVar99._8_4_ * auVar121._8_4_;
          auVar66._12_4_ = auVar99._12_4_ * auVar121._12_4_;
          auVar66._16_4_ = auVar99._16_4_ * auVar121._16_4_;
          auVar66._20_4_ = auVar99._20_4_ * auVar121._20_4_;
          auVar66._24_4_ = auVar99._24_4_ * auVar121._24_4_;
          auVar66._28_4_ = auVar100._28_4_;
          auVar96 = vfmsub231ps_fma(auVar66,auVar98,auVar171);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar173._0_4_ = auVar171._0_4_ * local_7c0._0_4_;
          auVar173._4_4_ = auVar171._4_4_ * local_7c0._4_4_;
          auVar173._8_4_ = auVar171._8_4_ * local_7c0._8_4_;
          auVar173._12_4_ = auVar171._12_4_ * local_7c0._12_4_;
          auVar173._16_4_ = auVar171._16_4_ * local_7c0._16_4_;
          auVar173._20_4_ = auVar171._20_4_ * local_7c0._20_4_;
          auVar173._24_4_ = auVar171._24_4_ * local_7c0._24_4_;
          auVar173._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar173,auVar121,auVar129);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
          auVar174._0_4_ = auVar122._0_4_ * auVar175._0_4_;
          auVar174._4_4_ = auVar122._4_4_ * auVar175._4_4_;
          auVar174._8_4_ = auVar122._8_4_ * auVar175._8_4_;
          auVar174._12_4_ = auVar122._12_4_ * auVar175._12_4_;
          auVar174._16_4_ = auVar122._16_4_ * auVar175._16_4_;
          auVar174._20_4_ = auVar122._20_4_ * auVar175._20_4_;
          auVar174._24_4_ = auVar122._24_4_ * auVar175._24_4_;
          auVar174._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar174,auVar181,auVar107);
          auVar67._4_4_ = auVar220._4_4_ * auVar107._4_4_;
          auVar67._0_4_ = auVar220._0_4_ * auVar107._0_4_;
          auVar67._8_4_ = auVar220._8_4_ * auVar107._8_4_;
          auVar67._12_4_ = auVar220._12_4_ * auVar107._12_4_;
          auVar67._16_4_ = auVar220._16_4_ * auVar107._16_4_;
          auVar67._20_4_ = auVar220._20_4_ * auVar107._20_4_;
          auVar67._24_4_ = auVar220._24_4_ * auVar107._24_4_;
          auVar67._28_4_ = auVar98._28_4_;
          auVar95 = vfmsub231ps_fma(auVar67,auVar106,auVar122);
          auVar68._4_4_ = auVar181._4_4_ * auVar106._4_4_;
          auVar68._0_4_ = auVar181._0_4_ * auVar106._0_4_;
          auVar68._8_4_ = auVar181._8_4_ * auVar106._8_4_;
          auVar68._12_4_ = auVar181._12_4_ * auVar106._12_4_;
          auVar68._16_4_ = auVar181._16_4_ * auVar106._16_4_;
          auVar68._20_4_ = auVar181._20_4_ * auVar106._20_4_;
          auVar68._24_4_ = auVar181._24_4_ * auVar106._24_4_;
          auVar68._28_4_ = auVar106._28_4_;
          auVar139 = vfmsub231ps_fma(auVar68,auVar220,auVar175);
          auVar107 = ZEXT832(0) << 0x20;
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar107,ZEXT1632(auVar17));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,ZEXT1632(auVar95));
          auVar175 = vmaxps_avx(ZEXT1632(auVar96),ZEXT1632(auVar95));
          auVar175 = vcmpps_avx(auVar175,auVar107,2);
          auVar17 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
          auVar12 = vpand_avx(auVar17,auVar12);
          auVar175 = vpmovsxwd_avx2(auVar12);
          auVar106 = local_7c0;
          if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar175 >> 0x7f,0) == '\0') &&
                (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0xbf,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar175[0x1f]) {
LAB_01101210:
            auVar190 = auVar106;
            auVar156._8_8_ = local_6a0[1]._8_8_;
            auVar156._0_8_ = local_6a0[1]._0_8_;
            auVar156._16_8_ = local_6a0[1]._16_8_;
            auVar156._24_8_ = local_6a0[1]._24_8_;
          }
          else {
            auVar69._4_4_ = auVar171._4_4_ * auVar122._4_4_;
            auVar69._0_4_ = auVar171._0_4_ * auVar122._0_4_;
            auVar69._8_4_ = auVar171._8_4_ * auVar122._8_4_;
            auVar69._12_4_ = auVar171._12_4_ * auVar122._12_4_;
            auVar69._16_4_ = auVar171._16_4_ * auVar122._16_4_;
            auVar69._20_4_ = auVar171._20_4_ * auVar122._20_4_;
            auVar69._24_4_ = auVar171._24_4_ * auVar122._24_4_;
            auVar69._28_4_ = auVar175._28_4_;
            auVar94 = vfmsub231ps_fma(auVar69,auVar220,auVar129);
            auVar182._0_4_ = auVar129._0_4_ * auVar181._0_4_;
            auVar182._4_4_ = auVar129._4_4_ * auVar181._4_4_;
            auVar182._8_4_ = auVar129._8_4_ * auVar181._8_4_;
            auVar182._12_4_ = auVar129._12_4_ * auVar181._12_4_;
            auVar182._16_4_ = auVar129._16_4_ * auVar181._16_4_;
            auVar182._20_4_ = auVar129._20_4_ * auVar181._20_4_;
            auVar182._24_4_ = auVar129._24_4_ * auVar181._24_4_;
            auVar182._28_4_ = 0;
            auVar120 = vfmsub231ps_fma(auVar182,auVar99,auVar122);
            auVar70._4_4_ = auVar99._4_4_ * auVar220._4_4_;
            auVar70._0_4_ = auVar99._0_4_ * auVar220._0_4_;
            auVar70._8_4_ = auVar99._8_4_ * auVar220._8_4_;
            auVar70._12_4_ = auVar99._12_4_ * auVar220._12_4_;
            auVar70._16_4_ = auVar99._16_4_ * auVar220._16_4_;
            auVar70._20_4_ = auVar99._20_4_ * auVar220._20_4_;
            auVar70._24_4_ = auVar99._24_4_ * auVar220._24_4_;
            auVar70._28_4_ = auVar220._28_4_;
            auVar151 = vfmsub231ps_fma(auVar70,auVar181,auVar171);
            auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar120),ZEXT1632(auVar151));
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar94),auVar107);
            auVar175 = vrcpps_avx(ZEXT1632(auVar119));
            auVar226._8_4_ = 0x3f800000;
            auVar226._0_8_ = 0x3f8000003f800000;
            auVar226._12_4_ = 0x3f800000;
            auVar226._16_4_ = 0x3f800000;
            auVar226._20_4_ = 0x3f800000;
            auVar226._24_4_ = 0x3f800000;
            auVar226._28_4_ = 0x3f800000;
            auVar227 = ZEXT3264(auVar226);
            auVar17 = vfnmadd213ps_fma(auVar175,ZEXT1632(auVar119),auVar226);
            auVar139 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar175,auVar175);
            auVar190 = ZEXT1632(auVar139);
            auVar71._4_4_ = auVar151._4_4_ * local_7c0._4_4_;
            auVar71._0_4_ = auVar151._0_4_ * local_7c0._0_4_;
            auVar71._8_4_ = auVar151._8_4_ * local_7c0._8_4_;
            auVar71._12_4_ = auVar151._12_4_ * local_7c0._12_4_;
            auVar71._16_4_ = local_7c0._16_4_ * 0.0;
            auVar71._20_4_ = local_7c0._20_4_ * 0.0;
            auVar71._24_4_ = local_7c0._24_4_ * 0.0;
            auVar71._28_4_ = auVar121._28_4_;
            auVar17 = vfmadd231ps_fma(auVar71,ZEXT1632(auVar120),auVar121);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar94),auVar98);
            fVar117 = auVar139._0_4_;
            fVar192 = auVar139._4_4_;
            fVar194 = auVar139._8_4_;
            fVar196 = auVar139._12_4_;
            auVar175 = ZEXT1632(CONCAT412(fVar196 * auVar17._12_4_,
                                          CONCAT48(fVar194 * auVar17._8_4_,
                                                   CONCAT44(fVar192 * auVar17._4_4_,
                                                            fVar117 * auVar17._0_4_))));
            uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar155._4_4_ = uVar90;
            auVar155._0_4_ = uVar90;
            auVar155._8_4_ = uVar90;
            auVar155._12_4_ = uVar90;
            auVar155._16_4_ = uVar90;
            auVar155._20_4_ = uVar90;
            auVar155._24_4_ = uVar90;
            auVar155._28_4_ = uVar90;
            auVar80._4_4_ = uStack_65c;
            auVar80._0_4_ = local_660;
            auVar80._8_4_ = uStack_658;
            auVar80._12_4_ = uStack_654;
            auVar80._16_4_ = uStack_650;
            auVar80._20_4_ = uStack_64c;
            auVar80._24_4_ = uStack_648;
            auVar80._28_4_ = uStack_644;
            auVar98 = vcmpps_avx(auVar80,auVar175,2);
            auVar121 = vcmpps_avx(auVar175,auVar155,2);
            auVar98 = vandps_avx(auVar121,auVar98);
            auVar17 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar12 = vpand_avx(auVar12,auVar17);
            auVar98 = vpmovsxwd_avx2(auVar12);
            auVar106 = ZEXT1632(auVar139);
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar98 >> 0x7f,0) == '\0') &&
                  (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0xbf,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar98[0x1f]) goto LAB_01101210;
            auVar98 = vcmpps_avx(ZEXT1632(auVar119),ZEXT832(0) << 0x20,4);
            auVar17 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar12 = vpand_avx(auVar12,auVar17);
            auVar98 = vpmovsxwd_avx2(auVar12);
            auVar156._8_8_ = local_6a0[1]._8_8_;
            auVar156._0_8_ = local_6a0[1]._0_8_;
            auVar156._16_8_ = local_6a0[1]._16_8_;
            auVar156._24_8_ = local_6a0[1]._24_8_;
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0x7f,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0xbf,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar98[0x1f] < '\0') {
              auVar106 = ZEXT1632(CONCAT412(fVar196 * auVar96._12_4_,
                                            CONCAT48(fVar194 * auVar96._8_4_,
                                                     CONCAT44(fVar192 * auVar96._4_4_,
                                                              fVar117 * auVar96._0_4_))));
              auVar72._28_4_ = SUB84(local_6a0[1]._24_8_,4);
              auVar72._0_28_ =
                   ZEXT1628(CONCAT412(fVar196 * auVar95._12_4_,
                                      CONCAT48(fVar194 * auVar95._8_4_,
                                               CONCAT44(fVar192 * auVar95._4_4_,
                                                        fVar117 * auVar95._0_4_))));
              auVar190._8_4_ = 0x3f800000;
              auVar190._0_8_ = 0x3f8000003f800000;
              auVar190._12_4_ = 0x3f800000;
              auVar190._16_4_ = 0x3f800000;
              auVar190._20_4_ = 0x3f800000;
              auVar190._24_4_ = 0x3f800000;
              auVar190._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar190,auVar106);
              local_780 = vblendvps_avx(auVar121,auVar106,auVar19);
              auVar121 = vsubps_avx(auVar190,auVar72);
              local_4e0 = vblendvps_avx(auVar121,auVar72,auVar19);
              auVar156 = auVar98;
              local_5e0 = auVar175;
            }
          }
          auVar221 = ZEXT3264(local_620);
          auVar206 = ZEXT3264(CONCAT428(fStack_4e4,
                                        CONCAT424(fStack_4e8,
                                                  CONCAT420(fStack_4ec,
                                                            CONCAT416(fStack_4f0,
                                                                      CONCAT412(fStack_4f4,
                                                                                CONCAT48(fStack_4f8,
                                                                                         CONCAT44(
                                                  fStack_4fc,local_500))))))));
          if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar156 >> 0x7f,0) != '\0') ||
                (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar156 >> 0xbf,0) != '\0') ||
              (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar156[0x1f] < '\0') {
            auVar98 = vsubps_avx(auVar101,local_520);
            auVar12 = vfmadd213ps_fma(auVar98,local_780,local_520);
            fVar117 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar73._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar117;
            auVar73._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar117;
            auVar73._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar117;
            auVar73._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar117;
            auVar73._16_4_ = fVar117 * 0.0;
            auVar73._20_4_ = fVar117 * 0.0;
            auVar73._24_4_ = fVar117 * 0.0;
            auVar73._28_4_ = fVar117;
            auVar98 = vcmpps_avx(local_5e0,auVar73,6);
            auVar121 = auVar156 & auVar98;
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar131._8_4_ = 0xbf800000;
              auVar131._0_8_ = 0xbf800000bf800000;
              auVar131._12_4_ = 0xbf800000;
              auVar131._16_4_ = 0xbf800000;
              auVar131._20_4_ = 0xbf800000;
              auVar131._24_4_ = 0xbf800000;
              auVar131._28_4_ = 0xbf800000;
              auVar150._8_4_ = 0x40000000;
              auVar150._0_8_ = 0x4000000040000000;
              auVar150._12_4_ = 0x40000000;
              auVar150._16_4_ = 0x40000000;
              auVar150._20_4_ = 0x40000000;
              auVar150._24_4_ = 0x40000000;
              auVar150._28_4_ = 0x40000000;
              auVar12 = vfmadd213ps_fma(local_4e0,auVar150,auVar131);
              local_3c0 = local_780;
              local_3a0 = ZEXT1632(auVar12);
              local_380 = local_5e0;
              local_340 = local_870;
              uStack_338 = uStack_868;
              local_330 = local_880;
              uStack_328 = uStack_878;
              local_320 = local_890;
              uStack_318 = uStack_888;
              pGVar9 = (context->scene->geometries).items[uVar7].ptr;
              auVar137 = ZEXT3264(local_780);
              local_4e0 = local_3a0;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_6c0 = vandps_avx(auVar98,auVar156);
                fVar138 = (float)local_360;
                local_2e0[0] = (fVar138 + local_780._0_4_ + 0.0) * local_100;
                local_2e0[1] = (fVar138 + local_780._4_4_ + 1.0) * fStack_fc;
                local_2e0[2] = (fVar138 + local_780._8_4_ + 2.0) * fStack_f8;
                local_2e0[3] = (fVar138 + local_780._12_4_ + 3.0) * fStack_f4;
                fStack_2d0 = (fVar138 + local_780._16_4_ + 4.0) * fStack_f0;
                fStack_2cc = (fVar138 + local_780._20_4_ + 5.0) * fStack_ec;
                fStack_2c8 = (fVar138 + local_780._24_4_ + 6.0) * fStack_e8;
                fStack_2c4 = fVar138 + local_780._28_4_ + 7.0;
                local_4e0._0_8_ = auVar12._0_8_;
                local_4e0._8_8_ = auVar12._8_8_;
                local_2c0 = local_4e0._0_8_;
                uStack_2b8 = local_4e0._8_8_;
                uStack_2b0 = 0;
                uStack_2a8 = 0;
                local_2a0 = local_5e0;
                auVar132._8_4_ = 0x7f800000;
                auVar132._0_8_ = 0x7f8000007f800000;
                auVar132._12_4_ = 0x7f800000;
                auVar132._16_4_ = 0x7f800000;
                auVar132._20_4_ = 0x7f800000;
                auVar132._24_4_ = 0x7f800000;
                auVar132._28_4_ = 0x7f800000;
                auVar98 = vblendvps_avx(auVar132,local_5e0,local_6c0);
                auVar121 = vshufps_avx(auVar98,auVar98,0xb1);
                auVar121 = vminps_avx(auVar98,auVar121);
                auVar175 = vshufpd_avx(auVar121,auVar121,5);
                auVar121 = vminps_avx(auVar121,auVar175);
                auVar175 = vpermpd_avx2(auVar121,0x4e);
                auVar121 = vminps_avx(auVar121,auVar175);
                auVar121 = vcmpps_avx(auVar98,auVar121,0);
                auVar175 = local_6c0 & auVar121;
                auVar98 = local_6c0;
                if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar175 >> 0x7f,0) != '\0') ||
                      (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar175 >> 0xbf,0) != '\0') ||
                    (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar175[0x1f] < '\0') {
                  auVar98 = vandps_avx(auVar121,local_6c0);
                }
                uVar84 = vmovmskps_avx(auVar98);
                uVar20 = 0;
                for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                  uVar20 = uVar20 + 1;
                }
                uVar86 = (ulong)uVar20;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar138 = local_2e0[uVar86];
                  uVar90 = *(undefined4 *)((long)&local_2c0 + uVar86 * 4);
                  fVar111 = 1.0 - fVar138;
                  fVar110 = fVar111 * fVar111 * -3.0;
                  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * fVar111)),
                                            ZEXT416((uint)(fVar138 * fVar111)),ZEXT416(0xc0000000));
                  auVar17 = vfmsub132ss_fma(ZEXT416((uint)(fVar138 * fVar111)),
                                            ZEXT416((uint)(fVar138 * fVar138)),ZEXT416(0x40000000));
                  fVar111 = auVar12._0_4_ * 3.0;
                  fVar112 = auVar17._0_4_ * 3.0;
                  fVar114 = fVar138 * fVar138 * 3.0;
                  auVar168._0_4_ = fVar114 * fVar113;
                  auVar168._4_4_ = fVar114 * fVar75;
                  auVar168._8_4_ = fVar114 * fVar76;
                  auVar168._12_4_ = fVar114 * fVar77;
                  auVar142._4_4_ = fVar112;
                  auVar142._0_4_ = fVar112;
                  auVar142._8_4_ = fVar112;
                  auVar142._12_4_ = fVar112;
                  auVar12 = vfmadd132ps_fma(auVar142,auVar168,auVar16);
                  auVar153._4_4_ = fVar111;
                  auVar153._0_4_ = fVar111;
                  auVar153._8_4_ = fVar111;
                  auVar153._12_4_ = fVar111;
                  auVar12 = vfmadd132ps_fma(auVar153,auVar12,auVar15);
                  auVar143._4_4_ = fVar110;
                  auVar143._0_4_ = fVar110;
                  auVar143._8_4_ = fVar110;
                  auVar143._12_4_ = fVar110;
                  auVar12 = vfmadd132ps_fma(auVar143,auVar12,auVar13);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar86 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
                  uVar222 = vextractps_avx(auVar12,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar222;
                  uVar222 = vextractps_avx(auVar12,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar222;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar138;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar90;
                  *(uint *)(ray + k * 4 + 0x220) = uVar83;
                  *(uint *)(ray + k * 4 + 0x240) = uVar7;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar137 = ZEXT864(0) << 0x20;
                  auVar98 = vpcmpeqd_avx2(auVar190,auVar190);
                  auVar157 = ZEXT3264(auVar98);
                  _local_5a0 = *pauVar2;
                  local_35c = iVar82;
                  local_350 = uVar78;
                  uStack_348 = uVar79;
                  while( true ) {
                    local_1c0 = local_2e0[uVar86];
                    local_1a0 = *(undefined4 *)((long)&local_2c0 + uVar86 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar86 * 4);
                    fVar111 = 1.0 - local_1c0;
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * fVar111)),
                                              ZEXT416((uint)(local_1c0 * fVar111)),
                                              ZEXT416(0xc0000000));
                    auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar111)),
                                              ZEXT416((uint)(local_1c0 * local_1c0)),
                                              ZEXT416(0x40000000));
                    fVar138 = auVar12._0_4_ * 3.0;
                    fVar110 = local_1c0 * local_1c0 * 3.0;
                    auVar169._0_4_ = fVar110 * fVar113;
                    auVar169._4_4_ = fVar110 * fVar75;
                    auVar169._8_4_ = fVar110 * fVar76;
                    auVar169._12_4_ = fVar110 * fVar77;
                    auVar144._4_4_ = fVar138;
                    auVar144._0_4_ = fVar138;
                    auVar144._8_4_ = fVar138;
                    auVar144._12_4_ = fVar138;
                    auVar12 = vfmadd132ps_fma(auVar144,auVar169,auVar16);
                    fVar138 = auVar17._0_4_ * 3.0;
                    auVar161._4_4_ = fVar138;
                    auVar161._0_4_ = fVar138;
                    auVar161._8_4_ = fVar138;
                    auVar161._12_4_ = fVar138;
                    auVar12 = vfmadd132ps_fma(auVar161,auVar12,auVar15);
                    fVar138 = fVar111 * fVar111 * -3.0;
                    local_810.context = context->user;
                    auVar145._4_4_ = fVar138;
                    auVar145._0_4_ = fVar138;
                    auVar145._8_4_ = fVar138;
                    auVar145._12_4_ = fVar138;
                    auVar17 = vfmadd132ps_fma(auVar145,auVar12,auVar14);
                    local_220 = auVar17._0_4_;
                    uStack_21c = local_220;
                    uStack_218 = local_220;
                    uStack_214 = local_220;
                    uStack_210 = local_220;
                    uStack_20c = local_220;
                    uStack_208 = local_220;
                    uStack_204 = local_220;
                    auVar12 = vmovshdup_avx(auVar17);
                    local_200 = auVar12._0_8_;
                    uStack_1f8 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1e8 = local_200;
                    auVar12 = vshufps_avx(auVar17,auVar17,0xaa);
                    local_1e0 = auVar12._0_8_;
                    uStack_1d8 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1c8 = local_1e0;
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_560._0_8_;
                    uStack_178 = local_560._8_8_;
                    uStack_170 = CONCAT44(uStack_54c,uStack_550);
                    uStack_168 = CONCAT44(uStack_544,uStack_548);
                    local_160 = local_540;
                    uStack_158 = uStack_538;
                    uStack_150 = CONCAT44(uStack_52c,uStack_530);
                    uStack_148 = CONCAT44(uStack_524,uStack_528);
                    local_788[1] = auVar157._0_32_;
                    *local_788 = auVar157._0_32_;
                    local_140 = (local_810.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_810.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_6a0[0] = local_280;
                    local_810.valid = (int *)local_6a0;
                    local_810.geometryUserPtr = pGVar9->userPtr;
                    local_810.hit = (RTCHitN *)&local_220;
                    local_810.N = 8;
                    local_810.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar98 = ZEXT1632(auVar157._0_16_);
                      auVar227 = ZEXT1664(auVar227._0_16_);
                      auVar229 = ZEXT1664(auVar229._0_16_);
                      (*pGVar9->intersectionFilterN)(&local_810);
                      auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                      auVar157 = ZEXT3264(auVar98);
                      auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar121 = vpcmpeqd_avx2(local_6a0[0],auVar137._0_32_);
                    auVar98 = auVar157._0_32_ & ~auVar121;
                    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar98 >> 0x7f,0) == '\0') &&
                          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar98 >> 0xbf,0) == '\0') &&
                        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar98[0x1f]) {
                      auVar121 = auVar157._0_32_ ^ auVar121;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar98 = ZEXT1632(auVar157._0_16_);
                        auVar227 = ZEXT1664(auVar227._0_16_);
                        auVar229 = ZEXT1664(auVar229._0_16_);
                        (*p_Var10)(&local_810);
                        auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                        auVar157 = ZEXT3264(auVar98);
                        auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar175 = vpcmpeqd_avx2(local_6a0[0],auVar137._0_32_);
                      auVar121 = auVar157._0_32_ ^ auVar175;
                      auVar98 = auVar157._0_32_ & ~auVar175;
                      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar98 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar98 >> 0x7f,0) != '\0') ||
                            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0xbf,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar98[0x1f] < '\0') {
                        auVar133._0_4_ = auVar157._0_4_ ^ auVar175._0_4_;
                        auVar133._4_4_ = auVar157._4_4_ ^ auVar175._4_4_;
                        auVar133._8_4_ = auVar157._8_4_ ^ auVar175._8_4_;
                        auVar133._12_4_ = auVar157._12_4_ ^ auVar175._12_4_;
                        auVar133._16_4_ = auVar157._16_4_ ^ auVar175._16_4_;
                        auVar133._20_4_ = auVar157._20_4_ ^ auVar175._20_4_;
                        auVar133._24_4_ = auVar157._24_4_ ^ auVar175._24_4_;
                        auVar133._28_4_ = auVar157._28_4_ ^ auVar175._28_4_;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])local_810.hit);
                        *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x20));
                        *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x40));
                        *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x60));
                        *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x80));
                        *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0xa0));
                        *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0xc0));
                        *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0xe0));
                        *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0x100));
                        *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar98;
                      }
                    }
                    auVar98 = local_5e0;
                    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar121 >> 0x7f,0) == '\0') &&
                          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar121 >> 0xbf,0) == '\0') &&
                        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar121[0x1f]) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar90;
                    }
                    else {
                      uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
                    }
                    *(undefined4 *)(local_6c0 + uVar86 * 4) = 0;
                    auVar108._4_4_ = uVar90;
                    auVar108._0_4_ = uVar90;
                    auVar108._8_4_ = uVar90;
                    auVar108._12_4_ = uVar90;
                    auVar108._16_4_ = uVar90;
                    auVar108._20_4_ = uVar90;
                    auVar108._24_4_ = uVar90;
                    auVar108._28_4_ = uVar90;
                    auVar175 = vcmpps_avx(auVar98,auVar108,2);
                    auVar121 = vandps_avx(auVar175,local_6c0);
                    local_6c0 = local_6c0 & auVar175;
                    if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_6c0 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                          (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                        (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_6c0[0x1f]) break;
                    auVar134._8_4_ = 0x7f800000;
                    auVar134._0_8_ = 0x7f8000007f800000;
                    auVar134._12_4_ = 0x7f800000;
                    auVar134._16_4_ = 0x7f800000;
                    auVar134._20_4_ = 0x7f800000;
                    auVar134._24_4_ = 0x7f800000;
                    auVar134._28_4_ = 0x7f800000;
                    auVar98 = vblendvps_avx(auVar134,auVar98,auVar121);
                    auVar175 = vshufps_avx(auVar98,auVar98,0xb1);
                    auVar175 = vminps_avx(auVar98,auVar175);
                    auVar106 = vshufpd_avx(auVar175,auVar175,5);
                    auVar175 = vminps_avx(auVar175,auVar106);
                    auVar106 = vpermpd_avx2(auVar175,0x4e);
                    auVar175 = vminps_avx(auVar175,auVar106);
                    auVar175 = vcmpps_avx(auVar98,auVar175,0);
                    auVar106 = auVar121 & auVar175;
                    auVar98 = auVar121;
                    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar106 >> 0x7f,0) != '\0') ||
                          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar106 >> 0xbf,0) != '\0') ||
                        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar106[0x1f] < '\0') {
                      auVar98 = vandps_avx(auVar175,auVar121);
                    }
                    uVar84 = vmovmskps_avx(auVar98);
                    uVar20 = 0;
                    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                      uVar20 = uVar20 + 1;
                    }
                    uVar86 = (ulong)uVar20;
                    local_6c0 = auVar121;
                  }
                  auVar221 = ZEXT3264(local_620);
                  auVar206 = ZEXT3264(CONCAT428(fStack_4e4,
                                                CONCAT424(fStack_4e8,
                                                          CONCAT420(fStack_4ec,
                                                                    CONCAT416(fStack_4f0,
                                                                              CONCAT412(fStack_4f4,
                                                                                        CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
                }
                auVar137 = ZEXT3264(local_780);
                fVar138 = (float)local_720;
                fVar110 = local_720._4_4_;
                fVar111 = (float)uStack_718;
                fVar112 = uStack_718._4_4_;
                fVar114 = (float)uStack_710;
                fVar115 = uStack_710._4_4_;
                fVar116 = (float)uStack_708;
                uVar222 = uStack_708._4_4_;
              }
              goto LAB_01100ef4;
            }
          }
          auVar137 = ZEXT3264(local_780);
        }
LAB_01100ef4:
        auVar157 = ZEXT3264(local_6e0);
      }
    }
    uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar97._4_4_ = uVar90;
    auVar97._0_4_ = uVar90;
    auVar97._8_4_ = uVar90;
    auVar97._12_4_ = uVar90;
    auVar12 = vcmpps_avx(local_3e0,auVar97,2);
    uVar83 = vmovmskps_avx(auVar12);
    uVar91 = (ulong)((uint)uVar91 & uVar83);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }